

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  BBox1f BVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  byte bVar59;
  uint uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  undefined4 uVar64;
  undefined8 unaff_RBP;
  long lVar65;
  bool bVar66;
  bool bVar67;
  float fVar68;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar93;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar94;
  undefined8 uVar95;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar140;
  float fVar141;
  undefined1 auVar125 [16];
  float fVar142;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar145;
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar144;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar179;
  float fVar180;
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar181;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vint4 ai;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar235;
  float fVar237;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar236;
  float fVar238;
  undefined1 auVar234 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar289 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar297;
  float fVar312;
  float fVar313;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar314;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar317 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [32];
  float local_658;
  float fStack_654;
  float fStack_650;
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  undefined1 local_568 [8];
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  uint local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  undefined1 local_3d8 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  float fVar200;
  float fVar218;
  undefined1 auVar331 [32];
  
  p00.field_0.i[0]._0_1_ = prim[1];
  uVar58 = (ulong)(byte)p00.field_0.i[0]._0_1_;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  lVar61 = uVar58 * 0x25;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)p00.field_0.i[0]._0_1_ * 0x10 + 6)))
  ;
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x11 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  fVar68 = *(float *)(prim + lVar61 + 0x12);
  auVar164 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar94 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar61 + 0x16)) *
           *(float *)(prim + lVar61 + 0x1a);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar267._0_4_ = fVar68 * auVar164._0_4_;
  auVar267._4_4_ = fVar68 * auVar164._4_4_;
  auVar267._8_4_ = fVar68 * auVar164._8_4_;
  auVar267._12_4_ = fVar68 * auVar164._12_4_;
  auVar298._0_4_ = fVar68 * auVar16._0_4_;
  auVar298._4_4_ = fVar68 * auVar16._4_4_;
  auVar298._8_4_ = fVar68 * auVar16._8_4_;
  auVar298._12_4_ = fVar68 * auVar16._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar22 = vcvtdq2ps_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar24);
  auVar24 = vshufps_avx(auVar298,auVar298,0x55);
  auVar164 = vshufps_avx(auVar298,auVar298,0xaa);
  fVar68 = auVar164._0_4_;
  auVar192._0_4_ = fVar68 * auVar19._0_4_;
  fVar92 = auVar164._4_4_;
  auVar192._4_4_ = fVar92 * auVar19._4_4_;
  fVar144 = auVar164._8_4_;
  auVar192._8_4_ = fVar144 * auVar19._8_4_;
  fVar145 = auVar164._12_4_;
  auVar192._12_4_ = fVar145 * auVar19._12_4_;
  auVar256._0_4_ = fVar68 * auVar21._0_4_;
  auVar256._4_4_ = fVar92 * auVar21._4_4_;
  auVar256._8_4_ = fVar144 * auVar21._8_4_;
  auVar256._12_4_ = fVar145 * auVar21._12_4_;
  auVar242._0_4_ = fVar68 * auVar186._0_4_;
  auVar242._4_4_ = fVar92 * auVar186._4_4_;
  auVar242._8_4_ = fVar144 * auVar186._8_4_;
  auVar242._12_4_ = fVar145 * auVar186._12_4_;
  auVar69 = vfmadd231ps_fma(auVar192,auVar24,auVar16);
  auVar70 = vfmadd231ps_fma(auVar256,auVar24,auVar20);
  auVar97 = vfmadd231ps_fma(auVar242,auVar22,auVar24);
  auVar24 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar68 = auVar24._0_4_;
  auVar162._0_4_ = fVar68 * auVar19._0_4_;
  fVar92 = auVar24._4_4_;
  auVar162._4_4_ = fVar92 * auVar19._4_4_;
  fVar144 = auVar24._8_4_;
  auVar162._8_4_ = fVar144 * auVar19._8_4_;
  fVar145 = auVar24._12_4_;
  auVar162._12_4_ = fVar145 * auVar19._12_4_;
  auVar146._0_4_ = fVar68 * auVar21._0_4_;
  auVar146._4_4_ = fVar92 * auVar21._4_4_;
  auVar146._8_4_ = fVar144 * auVar21._8_4_;
  auVar146._12_4_ = fVar145 * auVar21._12_4_;
  auVar323._0_4_ = auVar186._0_4_ * fVar68;
  auVar323._4_4_ = auVar186._4_4_ * fVar92;
  auVar323._8_4_ = auVar186._8_4_ * fVar144;
  auVar323._12_4_ = auVar186._12_4_ * fVar145;
  auVar21 = vshufps_avx(auVar267,auVar267,0x55);
  auVar186 = vfmadd231ps_fma(auVar162,auVar21,auVar16);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar24 = vpmovsxwd_avx(auVar16);
  auVar98 = vfmadd231ps_fma(auVar146,auVar21,auVar20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar164 = vpmovsxwd_avx(auVar19);
  auVar125 = vfmadd231ps_fma(auVar323,auVar21,auVar22);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar187 = vpmovsxwd_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar185);
  auVar20 = vcvtdq2ps_avx(auVar23);
  auVar284._4_4_ = auVar298._0_4_;
  auVar284._0_4_ = auVar298._0_4_;
  auVar284._8_4_ = auVar298._0_4_;
  auVar284._12_4_ = auVar298._0_4_;
  auVar23 = vfmadd231ps_fma(auVar69,auVar284,auVar16);
  auVar69 = vfmadd231ps_fma(auVar70,auVar284,auVar19);
  auVar70 = vfmadd231ps_fma(auVar97,auVar20,auVar284);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar18 = vpmovsxwd_avx(auVar21);
  auVar268._4_4_ = auVar267._0_4_;
  auVar268._0_4_ = auVar267._0_4_;
  auVar268._8_4_ = auVar267._0_4_;
  auVar268._12_4_ = auVar267._0_4_;
  auVar97 = vfmadd231ps_fma(auVar186,auVar268,auVar16);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar185 = vpmovsxwd_avx(auVar22);
  auVar98 = vfmadd231ps_fma(auVar98,auVar268,auVar19);
  local_3d8._8_4_ = 0x7fffffff;
  local_3d8._0_8_ = 0x7fffffff7fffffff;
  local_3d8._12_4_ = 0x7fffffff;
  auVar125 = vfmadd231ps_fma(auVar125,auVar268,auVar20);
  auVar16 = vandps_avx(auVar23,local_3d8);
  auVar269._8_4_ = 0x219392ef;
  auVar269._0_8_ = 0x219392ef219392ef;
  auVar269._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar269,1);
  auVar19 = vblendvps_avx(auVar23,auVar269,auVar16);
  auVar16 = vandps_avx(auVar69,local_3d8);
  auVar16 = vcmpps_avx(auVar16,auVar269,1);
  auVar20 = vblendvps_avx(auVar69,auVar269,auVar16);
  auVar16 = vandps_avx(auVar70,local_3d8);
  auVar16 = vcmpps_avx(auVar16,auVar269,1);
  auVar16 = vblendvps_avx(auVar70,auVar269,auVar16);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar58 * 0x16 + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar289._4_4_ = fVar94;
  auVar289._0_4_ = fVar94;
  auVar289._8_4_ = fVar94;
  auVar289._12_4_ = fVar94;
  auVar21 = vcvtdq2ps_avx(auVar24);
  auVar22 = vcvtdq2ps_avx(auVar164);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar69 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar187);
  auVar22 = vcvtdq2ps_avx(auVar18);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar70 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar185);
  auVar22 = vcvtdq2ps_avx(auVar186);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar186 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar22 = vpmovsxwd_avx(auVar185);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar18 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar23);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar58 * 0x21 + 6);
  auVar22 = vpmovsxwd_avx(auVar24);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar185 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar58 * 0x1f + 6);
  auVar21 = vpmovsxwd_avx(auVar164);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar22 = vpmovsxwd_avx(auVar187);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar22 = vfmadd213ps_fma(auVar22,auVar289,auVar21);
  auVar21 = vrcpps_avx(auVar19);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar19,auVar21,auVar96);
  auVar21 = vfmadd132ps_fma(auVar19,auVar21,auVar21);
  auVar19 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar19,auVar96);
  auVar20 = vfmadd132ps_fma(auVar20,auVar19,auVar19);
  auVar19 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar19,auVar96);
  auVar19 = vfmadd132ps_fma(auVar16,auVar19,auVar19);
  auVar16 = vsubps_avx(auVar69,auVar97);
  auVar182._0_4_ = auVar21._0_4_ * auVar16._0_4_;
  auVar182._4_4_ = auVar21._4_4_ * auVar16._4_4_;
  auVar182._8_4_ = auVar21._8_4_ * auVar16._8_4_;
  auVar182._12_4_ = auVar21._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar70,auVar97);
  auVar163._0_4_ = auVar21._0_4_ * auVar16._0_4_;
  auVar163._4_4_ = auVar21._4_4_ * auVar16._4_4_;
  auVar163._8_4_ = auVar21._8_4_ * auVar16._8_4_;
  auVar163._12_4_ = auVar21._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar186,auVar98);
  auVar201._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar201._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar201._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar201._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar18,auVar98);
  auVar97._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar97._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar97._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar97._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar185,auVar125);
  auVar104._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar104._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar104._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar104._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar22,auVar125);
  auVar69._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar69._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar69._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar69._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar182,auVar163);
  auVar19 = vpminsd_avx(auVar201,auVar97);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vpminsd_avx(auVar104,auVar69);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar243._4_4_ = uVar64;
  auVar243._0_4_ = uVar64;
  auVar243._8_4_ = uVar64;
  auVar243._12_4_ = uVar64;
  auVar19 = vmaxps_avx(auVar19,auVar243);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar221._0_4_ = auVar16._0_4_ * 0.99999964;
  auVar221._4_4_ = auVar16._4_4_ * 0.99999964;
  auVar221._8_4_ = auVar16._8_4_ * 0.99999964;
  auVar221._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar182,auVar163);
  auVar19 = vpmaxsd_avx(auVar201,auVar97);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar19 = vpmaxsd_avx(auVar104,auVar69);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar125._4_4_ = uVar64;
  auVar125._0_4_ = uVar64;
  auVar125._8_4_ = uVar64;
  auVar125._12_4_ = uVar64;
  auVar19 = vminps_avx(auVar19,auVar125);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar70._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar16._12_4_ * 1.0000004;
  p00.field_0.i[0]._1_3_ = 0;
  auVar98[4] = p00.field_0.i[0]._0_1_;
  auVar98._0_4_ = p00.field_0.i[0];
  auVar98._5_3_ = 0;
  auVar98[8] = p00.field_0.i[0]._0_1_;
  auVar98._9_3_ = 0;
  auVar98[0xc] = p00.field_0.i[0]._0_1_;
  auVar98._13_3_ = 0;
  auVar19 = vpcmpgtd_avx(auVar98,_DAT_01f4ad30);
  auVar16 = vcmpps_avx(auVar221,auVar70,2);
  auVar16 = vandps_avx(auVar16,auVar19);
  uVar64 = vmovmskps_avx(auVar16);
  uVar58 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar64);
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_450 = prim;
LAB_0123c05a:
  if (uVar58 == 0) {
LAB_0123e188:
    return uVar58 != 0;
  }
  lVar61 = 0;
  for (uVar62 = uVar58; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar57 = *(uint *)(local_450 + 2);
  pGVar9 = (context->scene->geometries).items[uVar57].ptr;
  fVar68 = (pGVar9->time_range).lower;
  fVar92 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar68) / ((pGVar9->time_range).upper - fVar68));
  auVar16 = vroundss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),9);
  auVar16 = vminss_avx(auVar16,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar24 = vmaxss_avx(ZEXT816(0),auVar16);
  uVar8 = *(uint *)(local_450 + lVar61 * 4 + 6);
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar24._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar65);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar65);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar62);
  lVar61 = uVar62 + 1;
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
  lVar1 = uVar62 + 2;
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar62 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar243 = *pauVar3;
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar65);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar65);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar62);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar61);
  auVar186 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar68 = *pfVar4;
  fVar94 = pfVar4[1];
  fVar144 = pfVar4[2];
  fVar145 = pfVar4[3];
  auVar280._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar280._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar280._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar280._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar299._8_4_ = 0x3e2aaaab;
  auVar299._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar299._12_4_ = 0x3e2aaaab;
  auVar69 = vfmadd213ps_fma(auVar299,auVar20,auVar280);
  auVar324._8_4_ = 0x3f000000;
  auVar324._0_8_ = 0x3f0000003f000000;
  auVar324._12_4_ = 0x3f000000;
  auVar18 = vfmadd231ps_fma(auVar280,auVar20,auVar324);
  auVar164 = ZEXT816(0) << 0x20;
  auVar18 = vfnmadd231ps_fma(auVar18,auVar19,auVar164);
  auVar163 = vfnmadd231ps_fma(auVar18,auVar16,auVar324);
  auVar183._0_4_ = fVar68 * 0.0;
  auVar183._4_4_ = fVar94 * 0.0;
  auVar183._8_4_ = fVar144 * 0.0;
  auVar183._12_4_ = fVar145 * 0.0;
  auVar18 = vfmadd213ps_fma(auVar299,auVar186,auVar183);
  auVar147._8_4_ = 0x3f2aaaab;
  auVar147._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar147._12_4_ = 0x3f2aaaab;
  auVar18 = vfmadd231ps_fma(auVar18,auVar22,auVar147);
  auVar18 = vfmadd231ps_fma(auVar18,auVar21,auVar299);
  auVar185 = vfmadd231ps_fma(auVar183,auVar186,auVar324);
  auVar185 = vfnmadd231ps_fma(auVar185,auVar22,auVar164);
  auVar23 = vfnmadd231ps_fma(auVar185,auVar21,auVar324);
  auVar300._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar300._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar300._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar300._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar185 = vfmadd231ps_fma(auVar300,auVar164,auVar20);
  auVar185 = vfnmadd231ps_fma(auVar185,auVar324,auVar19);
  auVar182 = vfnmadd231ps_fma(auVar185,auVar164,auVar16);
  auVar244._0_4_ = fVar68 * 0.16666667;
  auVar244._4_4_ = fVar94 * 0.16666667;
  auVar244._8_4_ = fVar144 * 0.16666667;
  auVar244._12_4_ = fVar145 * 0.16666667;
  auVar185 = vfmadd231ps_fma(auVar244,auVar186,auVar147);
  auVar185 = vfmadd231ps_fma(auVar185,auVar22,auVar299);
  auVar185 = vfmadd231ps_fma(auVar185,auVar21,auVar164);
  auVar202._0_4_ = fVar68 * 0.5;
  auVar202._4_4_ = fVar94 * 0.5;
  auVar202._8_4_ = fVar144 * 0.5;
  auVar202._12_4_ = fVar145 * 0.5;
  auVar186 = vfmadd231ps_fma(auVar202,auVar164,auVar186);
  auVar22 = vfnmadd231ps_fma(auVar186,auVar324,auVar22);
  auVar186 = vfnmadd231ps_fma(auVar22,auVar164,auVar21);
  auVar21 = vshufps_avx(auVar163,auVar163,0xc9);
  auVar22 = vshufps_avx(auVar18,auVar18,0xc9);
  fVar239 = auVar163._0_4_;
  auVar99._0_4_ = fVar239 * auVar22._0_4_;
  fVar240 = auVar163._4_4_;
  auVar99._4_4_ = fVar240 * auVar22._4_4_;
  fVar241 = auVar163._8_4_;
  auVar99._8_4_ = fVar241 * auVar22._8_4_;
  fVar93 = auVar163._12_4_;
  auVar99._12_4_ = fVar93 * auVar22._12_4_;
  auVar97 = vfmsub231ps_fma(auVar99,auVar21,auVar18);
  auVar22 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar100._0_4_ = fVar239 * auVar22._0_4_;
  auVar100._4_4_ = fVar240 * auVar22._4_4_;
  auVar100._8_4_ = fVar241 * auVar22._8_4_;
  auVar100._12_4_ = fVar93 * auVar22._12_4_;
  auVar98 = vfmsub231ps_fma(auVar100,auVar21,auVar23);
  auVar21 = vshufps_avx(auVar182,auVar182,0xc9);
  auVar22 = vshufps_avx(auVar185,auVar185,0xc9);
  fVar297 = auVar182._0_4_;
  auVar101._0_4_ = fVar297 * auVar22._0_4_;
  fVar312 = auVar182._4_4_;
  auVar101._4_4_ = fVar312 * auVar22._4_4_;
  fVar313 = auVar182._8_4_;
  auVar101._8_4_ = fVar313 * auVar22._8_4_;
  fVar314 = auVar182._12_4_;
  auVar101._12_4_ = fVar314 * auVar22._12_4_;
  auVar125 = vfmsub231ps_fma(auVar101,auVar21,auVar185);
  auVar22 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar102._0_4_ = fVar297 * auVar22._0_4_;
  auVar102._4_4_ = fVar312 * auVar22._4_4_;
  auVar102._8_4_ = fVar313 * auVar22._8_4_;
  auVar102._12_4_ = fVar314 * auVar22._12_4_;
  auVar96 = vfmsub231ps_fma(auVar102,auVar21,auVar186);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar65);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar65);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
  auVar55 = *pauVar5;
  fVar143 = *(float *)pauVar5[1];
  lVar14 = *(long *)(lVar11 + 0x38 + lVar65);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar65);
  auVar257._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar257._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar257._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar257._12_4_ = fVar143 * 0.0;
  auVar70 = vfmadd213ps_fma(auVar299,auVar21,auVar257);
  auVar186 = vfmadd231ps_fma(auVar257,auVar21,auVar324);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar61);
  auVar18 = vfnmadd231ps_fma(auVar186,auVar22,ZEXT816(0) << 0x20);
  auVar186 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar62);
  auVar201 = vfnmadd231ps_fma(auVar18,auVar186,auVar324);
  auVar18 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
  pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
  fVar68 = *pfVar4;
  fVar94 = pfVar4[1];
  fVar144 = pfVar4[2];
  fVar145 = pfVar4[3];
  auVar153._0_4_ = fVar68 * 0.0;
  auVar153._4_4_ = fVar94 * 0.0;
  auVar153._8_4_ = fVar144 * 0.0;
  auVar153._12_4_ = fVar145 * 0.0;
  auVar23 = vfmadd213ps_fma(auVar299,auVar18,auVar153);
  auVar185 = *(undefined1 (*) [16])(lVar14 + lVar61 * lVar11);
  auVar103._8_4_ = 0x3f2aaaab;
  auVar103._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar103._12_4_ = 0x3f2aaaab;
  auVar164 = vfmadd231ps_fma(auVar23,auVar185,auVar103);
  auVar23 = *(undefined1 (*) [16])(lVar14 + uVar62 * lVar11);
  auVar187 = vfmadd231ps_fma(auVar164,auVar23,auVar299);
  auVar164 = vshufps_avx(auVar187,auVar187,0xc9);
  fVar235 = auVar201._0_4_;
  auVar222._0_4_ = fVar235 * auVar164._0_4_;
  fVar236 = auVar201._4_4_;
  auVar222._4_4_ = fVar236 * auVar164._4_4_;
  fVar237 = auVar201._8_4_;
  auVar222._8_4_ = fVar237 * auVar164._8_4_;
  fVar238 = auVar201._12_4_;
  auVar222._12_4_ = fVar238 * auVar164._12_4_;
  auVar164 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar146 = vfmsub231ps_fma(auVar222,auVar164,auVar187);
  auVar187 = vfmadd231ps_fma(auVar153,auVar18,auVar324);
  auVar187 = vfnmadd231ps_fma(auVar187,auVar185,_DAT_01f45a50);
  auVar104 = vfnmadd231ps_fma(auVar187,auVar23,auVar324);
  auVar187 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar184._0_4_ = fVar235 * auVar187._0_4_;
  auVar184._4_4_ = fVar236 * auVar187._4_4_;
  auVar184._8_4_ = fVar237 * auVar187._8_4_;
  auVar184._12_4_ = fVar238 * auVar187._12_4_;
  auVar187 = vfmsub231ps_fma(auVar184,auVar164,auVar104);
  auVar71._0_4_ = fVar68 * 0.16666667;
  auVar71._4_4_ = fVar94 * 0.16666667;
  auVar71._8_4_ = fVar144 * 0.16666667;
  auVar71._12_4_ = fVar145 * 0.16666667;
  auVar223._8_4_ = 0x3f2aaaab;
  auVar223._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar223._12_4_ = 0x3f2aaaab;
  auVar164 = vfmadd231ps_fma(auVar71,auVar18,auVar223);
  auVar148._0_4_ = fVar68 * 0.5;
  auVar148._4_4_ = fVar94 * 0.5;
  auVar148._8_4_ = fVar144 * 0.5;
  auVar148._12_4_ = fVar145 * 0.5;
  auVar104 = ZEXT816(0) << 0x20;
  auVar18 = vfmadd231ps_fma(auVar148,auVar104,auVar18);
  auVar164 = vfmadd231ps_fma(auVar164,auVar185,auVar299);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar324,auVar185);
  auVar185 = vfmadd231ps_fma(auVar164,auVar23,auVar104);
  auVar23 = vfnmadd231ps_fma(auVar18,auVar104,auVar23);
  local_658 = auVar55._0_4_;
  fStack_654 = auVar55._4_4_;
  fStack_650 = auVar55._8_4_;
  auVar245._0_4_ = local_658 * 0.5;
  auVar245._4_4_ = fStack_654 * 0.5;
  auVar245._8_4_ = fStack_650 * 0.5;
  auVar245._12_4_ = fVar143 * 0.5;
  auVar18 = vfmadd231ps_fma(auVar245,auVar104,auVar21);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar324,auVar22);
  auVar242 = vfnmadd231ps_fma(auVar18,auVar104,auVar186);
  auVar18 = vshufps_avx(auVar185,auVar185,0xc9);
  fVar200 = auVar242._0_4_;
  auVar105._0_4_ = fVar200 * auVar18._0_4_;
  fVar220 = auVar242._4_4_;
  auVar105._4_4_ = fVar220 * auVar18._4_4_;
  fVar218 = auVar242._8_4_;
  auVar105._8_4_ = fVar218 * auVar18._8_4_;
  fVar219 = auVar242._12_4_;
  auVar105._12_4_ = fVar219 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar242,auVar242,0xc9);
  auVar104 = vfmsub231ps_fma(auVar105,auVar18,auVar185);
  auVar185 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar72._0_4_ = fVar200 * auVar185._0_4_;
  auVar72._4_4_ = fVar220 * auVar185._4_4_;
  auVar72._8_4_ = fVar218 * auVar185._8_4_;
  auVar72._12_4_ = fVar219 * auVar185._12_4_;
  auVar162 = vfmsub231ps_fma(auVar72,auVar18,auVar23);
  fVar92 = fVar92 - auVar24._0_4_;
  local_568._0_4_ = auVar243._0_4_;
  local_568._4_4_ = auVar243._4_4_;
  uStack_560._0_4_ = auVar243._8_4_;
  uStack_560._4_4_ = auVar243._12_4_;
  auVar106._0_4_ = (float)local_568._0_4_ * 0.16666667;
  auVar106._4_4_ = (float)local_568._4_4_ * 0.16666667;
  auVar106._8_4_ = (float)uStack_560 * 0.16666667;
  auVar106._12_4_ = uStack_560._4_4_ * 0.16666667;
  auVar20 = vfmadd231ps_fma(auVar106,auVar223,auVar20);
  auVar18 = vfmadd231ps_fma(auVar69,auVar19,auVar223);
  auVar185 = vfmadd231ps_fma(auVar20,auVar19,auVar299);
  auVar20 = vpermilps_avx(auVar97,0xc9);
  auVar19 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar23 = vfmadd231ps_fma(auVar18,auVar16,auVar299);
  auVar24 = vfmadd231ps_fma(auVar185,auVar16,ZEXT816(0));
  auVar18 = vpermilps_avx(auVar98,0xc9);
  fVar94 = auVar19._0_4_;
  auVar185 = ZEXT416((uint)fVar94);
  auVar16 = vrsqrtss_avx(auVar185,auVar185);
  fVar68 = auVar16._0_4_;
  auVar16 = vdpps_avx(auVar20,auVar18,0x7f);
  fVar68 = fVar68 * 1.5 + fVar94 * -0.5 * fVar68 * fVar68 * fVar68;
  auVar165._0_4_ = fVar94 * auVar18._0_4_;
  auVar165._4_4_ = fVar94 * auVar18._4_4_;
  auVar165._8_4_ = fVar94 * auVar18._8_4_;
  auVar165._12_4_ = fVar94 * auVar18._12_4_;
  fVar94 = auVar16._0_4_;
  auVar203._0_4_ = fVar94 * auVar20._0_4_;
  auVar203._4_4_ = fVar94 * auVar20._4_4_;
  auVar203._8_4_ = fVar94 * auVar20._8_4_;
  auVar203._12_4_ = fVar94 * auVar20._12_4_;
  auVar18 = vsubps_avx(auVar165,auVar203);
  auVar16 = vrcpss_avx(auVar185,auVar185);
  auVar19 = vfnmadd213ss_fma(auVar19,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar144 = auVar16._0_4_ * auVar19._0_4_;
  auVar185 = vpermilps_avx(auVar125,0xc9);
  fVar124 = auVar20._0_4_ * fVar68;
  fVar140 = auVar20._4_4_ * fVar68;
  fVar141 = auVar20._8_4_ * fVar68;
  fVar142 = auVar20._12_4_ * fVar68;
  auVar19 = vdpps_avx(auVar185,auVar185,0x7f);
  auVar16 = vblendps_avx(auVar19,_DAT_01f45a50,0xe);
  auVar20 = vrsqrtss_avx(auVar16,auVar16);
  fVar145 = auVar19._0_4_;
  fVar94 = auVar20._0_4_;
  fVar94 = fVar94 * 1.5 + fVar94 * fVar94 * fVar145 * -0.5 * fVar94;
  auVar20 = vpermilps_avx(auVar96,0xc9);
  auVar325._0_4_ = fVar145 * auVar20._0_4_;
  auVar325._4_4_ = fVar145 * auVar20._4_4_;
  auVar325._8_4_ = fVar145 * auVar20._8_4_;
  auVar325._12_4_ = fVar145 * auVar20._12_4_;
  auVar20 = vdpps_avx(auVar185,auVar20,0x7f);
  fVar145 = auVar20._0_4_;
  auVar224._0_4_ = fVar145 * auVar185._0_4_;
  auVar224._4_4_ = fVar145 * auVar185._4_4_;
  auVar224._8_4_ = fVar145 * auVar185._8_4_;
  auVar224._12_4_ = fVar145 * auVar185._12_4_;
  auVar20 = vsubps_avx(auVar325,auVar224);
  auVar16 = vrcpss_avx(auVar16,auVar16);
  auVar19 = vfnmadd213ss_fma(auVar19,auVar16,ZEXT416(0x40000000));
  fVar145 = auVar16._0_4_ * auVar19._0_4_;
  fVar161 = auVar185._0_4_ * fVar94;
  fVar179 = auVar185._4_4_ * fVar94;
  fVar180 = auVar185._8_4_ * fVar94;
  fVar181 = auVar185._12_4_ * fVar94;
  auVar16 = vshufps_avx(auVar163,auVar163,0xff);
  auVar19 = vshufps_avx(auVar23,auVar23,0xff);
  auVar225._0_4_ = auVar19._0_4_ * fVar124;
  auVar225._4_4_ = auVar19._4_4_ * fVar140;
  auVar225._8_4_ = auVar19._8_4_ * fVar141;
  auVar225._12_4_ = auVar19._12_4_ * fVar142;
  auVar73._0_4_ = auVar16._0_4_ * fVar124 + auVar19._0_4_ * fVar68 * fVar144 * auVar18._0_4_;
  auVar73._4_4_ = auVar16._4_4_ * fVar140 + auVar19._4_4_ * fVar68 * fVar144 * auVar18._4_4_;
  auVar73._8_4_ = auVar16._8_4_ * fVar141 + auVar19._8_4_ * fVar68 * fVar144 * auVar18._8_4_;
  auVar73._12_4_ = auVar16._12_4_ * fVar142 + auVar19._12_4_ * fVar68 * fVar144 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar23,auVar225);
  local_648._0_4_ = auVar23._0_4_ + auVar225._0_4_;
  local_648._4_4_ = auVar23._4_4_ + auVar225._4_4_;
  uStack_640._0_4_ = auVar23._8_4_ + auVar225._8_4_;
  uStack_640._4_4_ = auVar23._12_4_ + auVar225._12_4_;
  auVar185 = vsubps_avx(auVar163,auVar73);
  auVar16 = vshufps_avx(auVar182,auVar182,0xff);
  auVar19 = vshufps_avx(auVar24,auVar24,0xff);
  auVar166._0_4_ = auVar19._0_4_ * fVar161;
  auVar166._4_4_ = auVar19._4_4_ * fVar179;
  auVar166._8_4_ = auVar19._8_4_ * fVar180;
  auVar166._12_4_ = auVar19._12_4_ * fVar181;
  auVar149._0_4_ = auVar16._0_4_ * fVar161 + auVar19._0_4_ * fVar94 * auVar20._0_4_ * fVar145;
  auVar149._4_4_ = auVar16._4_4_ * fVar179 + auVar19._4_4_ * fVar94 * auVar20._4_4_ * fVar145;
  auVar149._8_4_ = auVar16._8_4_ * fVar180 + auVar19._8_4_ * fVar94 * auVar20._8_4_ * fVar145;
  auVar149._12_4_ = auVar16._12_4_ * fVar181 + auVar19._12_4_ * fVar94 * auVar20._12_4_ * fVar145;
  auVar20 = vsubps_avx(auVar24,auVar166);
  local_568._4_4_ = auVar24._4_4_ + auVar166._4_4_;
  local_568._0_4_ = auVar24._0_4_ + auVar166._0_4_;
  uStack_560._0_4_ = auVar24._8_4_ + auVar166._8_4_;
  uStack_560._4_4_ = auVar24._12_4_ + auVar166._12_4_;
  auVar23 = vsubps_avx(auVar182,auVar149);
  auVar74._8_4_ = 0x3e2aaaab;
  auVar74._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar74._12_4_ = 0x3e2aaaab;
  auVar301._0_4_ = local_658 * 0.16666667;
  auVar301._4_4_ = fStack_654 * 0.16666667;
  auVar301._8_4_ = fStack_650 * 0.16666667;
  auVar301._12_4_ = fVar143 * 0.16666667;
  auVar126._8_4_ = 0x3f2aaaab;
  auVar126._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar126._12_4_ = 0x3f2aaaab;
  auVar16 = vfmadd231ps_fma(auVar301,auVar126,auVar21);
  auVar19 = vfmadd231ps_fma(auVar70,auVar22,auVar126);
  auVar21 = vfmadd231ps_fma(auVar16,auVar22,auVar74);
  auVar22 = vpermilps_avx(auVar146,0xc9);
  auVar16 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar24 = vfmadd231ps_fma(auVar19,auVar186,auVar74);
  auVar328._12_4_ = 0;
  auVar328._0_12_ = ZEXT812(0);
  auVar164 = vfmadd231ps_fma(auVar21,auVar186,auVar328 << 0x20);
  auVar21 = vpermilps_avx(auVar187,0xc9);
  fVar94 = auVar16._0_4_;
  auVar186 = ZEXT416((uint)fVar94);
  auVar19 = vrsqrtss_avx(auVar186,auVar186);
  fVar68 = auVar19._0_4_;
  auVar19 = vdpps_avx(auVar22,auVar21,0x7f);
  fVar68 = fVar68 * 1.5 + fVar68 * fVar68 * fVar94 * -0.5 * fVar68;
  auVar167._0_4_ = fVar94 * auVar21._0_4_;
  auVar167._4_4_ = fVar94 * auVar21._4_4_;
  auVar167._8_4_ = fVar94 * auVar21._8_4_;
  auVar167._12_4_ = fVar94 * auVar21._12_4_;
  fVar94 = auVar19._0_4_;
  auVar226._0_4_ = fVar94 * auVar22._0_4_;
  auVar226._4_4_ = fVar94 * auVar22._4_4_;
  auVar226._8_4_ = fVar94 * auVar22._8_4_;
  auVar226._12_4_ = fVar94 * auVar22._12_4_;
  auVar21 = vsubps_avx(auVar167,auVar226);
  auVar19 = vrcpss_avx(auVar186,auVar186);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar144 = auVar19._0_4_ * auVar16._0_4_;
  auVar186 = vpermilps_avx(auVar104,0xc9);
  fVar143 = auVar22._0_4_ * fVar68;
  fVar124 = auVar22._4_4_ * fVar68;
  fVar140 = auVar22._8_4_ * fVar68;
  fVar141 = auVar22._12_4_ * fVar68;
  auVar16 = vdpps_avx(auVar186,auVar186,0x7f);
  fVar145 = auVar16._0_4_;
  auVar187 = ZEXT416((uint)fVar145);
  auVar19 = vrsqrtss_avx(auVar187,auVar187);
  fVar94 = auVar19._0_4_;
  fVar94 = fVar145 * -0.5 * fVar94 * fVar94 * fVar94 + fVar94 * 1.5;
  auVar19 = vpermilps_avx(auVar162,0xc9);
  auVar315._0_4_ = fVar145 * auVar19._0_4_;
  auVar315._4_4_ = fVar145 * auVar19._4_4_;
  auVar315._8_4_ = fVar145 * auVar19._8_4_;
  auVar315._12_4_ = fVar145 * auVar19._12_4_;
  auVar19 = vdpps_avx(auVar186,auVar19,0x7f);
  fVar145 = auVar19._0_4_;
  auVar281._0_4_ = fVar145 * auVar186._0_4_;
  auVar281._4_4_ = fVar145 * auVar186._4_4_;
  auVar281._8_4_ = fVar145 * auVar186._8_4_;
  auVar281._12_4_ = fVar145 * auVar186._12_4_;
  auVar22 = vsubps_avx(auVar315,auVar281);
  auVar19 = vrcpss_avx(auVar187,auVar187);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar19._0_4_ * auVar16._0_4_;
  fVar142 = auVar186._0_4_ * fVar94;
  fVar161 = auVar186._4_4_ * fVar94;
  fVar179 = auVar186._8_4_ * fVar94;
  fVar180 = auVar186._12_4_ * fVar94;
  auVar16 = vshufps_avx(auVar201,auVar201,0xff);
  auVar19 = vshufps_avx(auVar24,auVar24,0xff);
  auVar150._0_4_ = auVar19._0_4_ * fVar143;
  auVar150._4_4_ = auVar19._4_4_ * fVar124;
  auVar150._8_4_ = auVar19._8_4_ * fVar140;
  auVar150._12_4_ = auVar19._12_4_ * fVar141;
  auVar107._0_4_ = auVar16._0_4_ * fVar143 + auVar19._0_4_ * fVar68 * fVar144 * auVar21._0_4_;
  auVar107._4_4_ = auVar16._4_4_ * fVar124 + auVar19._4_4_ * fVar68 * fVar144 * auVar21._4_4_;
  auVar107._8_4_ = auVar16._8_4_ * fVar140 + auVar19._8_4_ * fVar68 * fVar144 * auVar21._8_4_;
  auVar107._12_4_ = auVar16._12_4_ * fVar141 + auVar19._12_4_ * fVar68 * fVar144 * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar24,auVar150);
  fVar144 = auVar24._0_4_ + auVar150._0_4_;
  fVar143 = auVar24._4_4_ + auVar150._4_4_;
  fVar124 = auVar24._8_4_ + auVar150._8_4_;
  fVar140 = auVar24._12_4_ + auVar150._12_4_;
  auVar186 = vsubps_avx(auVar201,auVar107);
  auVar16 = vshufps_avx(auVar242,auVar242,0xff);
  auVar19 = vshufps_avx(auVar164,auVar164,0xff);
  auVar168._0_4_ = auVar19._0_4_ * fVar142;
  auVar168._4_4_ = auVar19._4_4_ * fVar161;
  auVar168._8_4_ = auVar19._8_4_ * fVar179;
  auVar168._12_4_ = auVar19._12_4_ * fVar180;
  auVar108._0_4_ = auVar16._0_4_ * fVar142 + auVar19._0_4_ * fVar94 * auVar22._0_4_ * fVar145;
  auVar108._4_4_ = auVar16._4_4_ * fVar161 + auVar19._4_4_ * fVar94 * auVar22._4_4_ * fVar145;
  auVar108._8_4_ = auVar16._8_4_ * fVar179 + auVar19._8_4_ * fVar94 * auVar22._8_4_ * fVar145;
  auVar108._12_4_ = auVar16._12_4_ * fVar180 + auVar19._12_4_ * fVar94 * auVar22._12_4_ * fVar145;
  auVar16 = vsubps_avx(auVar164,auVar168);
  auVar169._0_4_ = auVar164._0_4_ + auVar168._0_4_;
  auVar169._4_4_ = auVar164._4_4_ + auVar168._4_4_;
  auVar169._8_4_ = auVar164._8_4_ + auVar168._8_4_;
  auVar169._12_4_ = auVar164._12_4_ + auVar168._12_4_;
  auVar19 = vsubps_avx(auVar242,auVar108);
  local_4d8 = auVar185._0_4_;
  fStack_4d4 = auVar185._4_4_;
  fStack_4d0 = auVar185._8_4_;
  fStack_4cc = auVar185._12_4_;
  auVar302._0_4_ = auVar18._0_4_ + local_4d8 * 0.33333334;
  auVar302._4_4_ = auVar18._4_4_ + fStack_4d4 * 0.33333334;
  auVar302._8_4_ = auVar18._8_4_ + fStack_4d0 * 0.33333334;
  auVar302._12_4_ = auVar18._12_4_ + fStack_4cc * 0.33333334;
  fVar68 = 1.0 - fVar92;
  auVar109._4_4_ = fVar68;
  auVar109._0_4_ = fVar68;
  auVar109._8_4_ = fVar68;
  auVar109._12_4_ = fVar68;
  auVar227._0_4_ = fVar92 * auVar21._0_4_;
  auVar227._4_4_ = fVar92 * auVar21._4_4_;
  auVar227._8_4_ = fVar92 * auVar21._8_4_;
  auVar227._12_4_ = fVar92 * auVar21._12_4_;
  local_418 = vfmadd231ps_fma(auVar227,auVar109,auVar18);
  auVar127._0_4_ = fVar92 * (auVar21._0_4_ + auVar186._0_4_ * 0.33333334);
  auVar127._4_4_ = fVar92 * (auVar21._4_4_ + auVar186._4_4_ * 0.33333334);
  auVar127._8_4_ = fVar92 * (auVar21._8_4_ + auVar186._8_4_ * 0.33333334);
  auVar127._12_4_ = fVar92 * (auVar21._12_4_ + auVar186._12_4_ * 0.33333334);
  auVar146 = vfmadd231ps_fma(auVar127,auVar109,auVar302);
  local_518._0_4_ = auVar23._0_4_;
  local_518._4_4_ = auVar23._4_4_;
  uStack_510._0_4_ = auVar23._8_4_;
  uStack_510._4_4_ = auVar23._12_4_;
  auVar128._0_4_ = (float)local_518._0_4_ * 0.33333334;
  auVar128._4_4_ = (float)local_518._4_4_ * 0.33333334;
  auVar128._8_4_ = (float)uStack_510 * 0.33333334;
  auVar128._12_4_ = uStack_510._4_4_ * 0.33333334;
  auVar21 = vsubps_avx(auVar20,auVar128);
  auVar303._0_4_ = (float)local_648._0_4_ + (fVar239 + auVar73._0_4_) * 0.33333334;
  auVar303._4_4_ = (float)local_648._4_4_ + (fVar240 + auVar73._4_4_) * 0.33333334;
  auVar303._8_4_ = (float)uStack_640 + (fVar241 + auVar73._8_4_) * 0.33333334;
  auVar303._12_4_ = uStack_640._4_4_ + (fVar93 + auVar73._12_4_) * 0.33333334;
  auVar270._0_4_ = (fVar297 + auVar149._0_4_) * 0.33333334;
  auVar270._4_4_ = (fVar312 + auVar149._4_4_) * 0.33333334;
  auVar270._8_4_ = (fVar313 + auVar149._8_4_) * 0.33333334;
  auVar270._12_4_ = (fVar314 + auVar149._12_4_) * 0.33333334;
  auVar22 = vsubps_avx(_local_568,auVar270);
  auVar282._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar282._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar282._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar282._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar16,auVar282);
  auVar246._0_4_ = (fVar200 + auVar108._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar220 + auVar108._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar218 + auVar108._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar219 + auVar108._12_4_) * 0.33333334;
  auVar186 = vsubps_avx(auVar169,auVar246);
  auVar283._0_4_ = fVar92 * auVar19._0_4_;
  auVar283._4_4_ = fVar92 * auVar19._4_4_;
  auVar283._8_4_ = fVar92 * auVar19._8_4_;
  auVar283._12_4_ = fVar92 * auVar19._12_4_;
  auVar204._0_4_ = fVar92 * auVar16._0_4_;
  auVar204._4_4_ = fVar92 * auVar16._4_4_;
  auVar204._8_4_ = fVar92 * auVar16._8_4_;
  auVar204._12_4_ = fVar92 * auVar16._12_4_;
  local_428 = vfmadd231ps_fma(auVar283,auVar109,auVar21);
  auVar104 = vfmadd231ps_fma(auVar204,auVar109,auVar20);
  auVar129._0_4_ = fVar92 * fVar144;
  auVar129._4_4_ = fVar92 * fVar143;
  auVar129._8_4_ = fVar92 * fVar124;
  auVar129._12_4_ = fVar92 * fVar140;
  auVar151._0_4_ = fVar92 * (fVar144 + (fVar235 + auVar107._0_4_) * 0.33333334);
  auVar151._4_4_ = fVar92 * (fVar143 + (fVar236 + auVar107._4_4_) * 0.33333334);
  auVar151._8_4_ = fVar92 * (fVar124 + (fVar237 + auVar107._8_4_) * 0.33333334);
  auVar151._12_4_ = fVar92 * (fVar140 + (fVar238 + auVar107._12_4_) * 0.33333334);
  auVar188._0_4_ = fVar92 * auVar186._0_4_;
  auVar188._4_4_ = fVar92 * auVar186._4_4_;
  auVar188._8_4_ = fVar92 * auVar186._8_4_;
  auVar188._12_4_ = fVar92 * auVar186._12_4_;
  auVar170._0_4_ = fVar92 * auVar169._0_4_;
  auVar170._4_4_ = fVar92 * auVar169._4_4_;
  auVar170._8_4_ = fVar92 * auVar169._8_4_;
  auVar170._12_4_ = fVar92 * auVar169._12_4_;
  _local_438 = vfmadd231ps_fma(auVar129,auVar109,_local_648);
  auVar162 = vfmadd231ps_fma(auVar151,auVar109,auVar303);
  _local_448 = vfmadd231ps_fma(auVar188,auVar109,auVar22);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar163 = vfmadd231ps_fma(auVar170,auVar109,_local_568);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3f8 = vsubps_avx(local_418,auVar16);
  auVar19 = vshufps_avx(local_3f8,local_3f8,0x55);
  auVar20 = vshufps_avx(local_3f8,local_3f8,0xaa);
  aVar7 = pre->ray_space[k].vy.field_0;
  fVar68 = pre->ray_space[k].vz.field_0.m128[0];
  fVar94 = pre->ray_space[k].vz.field_0.m128[1];
  fVar92 = pre->ray_space[k].vz.field_0.m128[2];
  fVar144 = pre->ray_space[k].vz.field_0.m128[3];
  auVar75._0_4_ = fVar68 * auVar20._0_4_;
  auVar75._4_4_ = fVar94 * auVar20._4_4_;
  auVar75._8_4_ = fVar92 * auVar20._8_4_;
  auVar75._12_4_ = fVar144 * auVar20._12_4_;
  auVar21 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar7,auVar19);
  local_408 = vsubps_avx(auVar146,auVar16);
  auVar19 = vshufps_avx(local_408,local_408,0x55);
  auVar20 = vshufps_avx(local_408,local_408,0xaa);
  auVar326._0_4_ = fVar68 * auVar20._0_4_;
  auVar326._4_4_ = fVar94 * auVar20._4_4_;
  auVar326._8_4_ = fVar92 * auVar20._8_4_;
  auVar326._12_4_ = fVar144 * auVar20._12_4_;
  auVar20 = vfmadd231ps_fma(auVar326,(undefined1  [16])aVar7,auVar19);
  auVar185 = vsubps_avx(local_428,auVar16);
  auVar19 = vshufps_avx(auVar185,auVar185,0xaa);
  auVar304._0_4_ = fVar68 * auVar19._0_4_;
  auVar304._4_4_ = fVar94 * auVar19._4_4_;
  auVar304._8_4_ = fVar92 * auVar19._8_4_;
  auVar304._12_4_ = fVar144 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar185,auVar185,0x55);
  auVar22 = vfmadd231ps_fma(auVar304,(undefined1  [16])aVar7,auVar19);
  auVar23 = vsubps_avx(auVar104,auVar16);
  auVar19 = vshufps_avx(auVar23,auVar23,0xaa);
  auVar316._0_4_ = fVar68 * auVar19._0_4_;
  auVar316._4_4_ = fVar94 * auVar19._4_4_;
  auVar316._8_4_ = fVar92 * auVar19._8_4_;
  auVar316._12_4_ = fVar144 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar23,auVar23,0x55);
  auVar186 = vfmadd231ps_fma(auVar316,(undefined1  [16])aVar7,auVar19);
  auVar24 = vsubps_avx(_local_438,auVar16);
  auVar19 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar171._0_4_ = fVar68 * auVar19._0_4_;
  auVar171._4_4_ = fVar94 * auVar19._4_4_;
  auVar171._8_4_ = fVar92 * auVar19._8_4_;
  auVar171._12_4_ = fVar144 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar24,auVar24,0x55);
  auVar18 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar19);
  auVar164 = vsubps_avx(auVar162,auVar16);
  auVar19 = vshufps_avx(auVar164,auVar164,0xaa);
  auVar228._0_4_ = fVar68 * auVar19._0_4_;
  auVar228._4_4_ = fVar94 * auVar19._4_4_;
  auVar228._8_4_ = fVar92 * auVar19._8_4_;
  auVar228._12_4_ = fVar144 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar164,auVar164,0x55);
  auVar70 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar7,auVar19);
  auVar187 = vsubps_avx(_local_448,auVar16);
  auVar19 = vshufps_avx(auVar187,auVar187,0xaa);
  auVar258._0_4_ = fVar68 * auVar19._0_4_;
  auVar258._4_4_ = fVar94 * auVar19._4_4_;
  auVar258._8_4_ = fVar92 * auVar19._8_4_;
  auVar258._12_4_ = fVar144 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar187,auVar187,0x55);
  auVar19 = vfmadd231ps_fma(auVar258,(undefined1  [16])aVar7,auVar19);
  auVar69 = vsubps_avx(auVar163,auVar16);
  auVar16 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar189._0_4_ = fVar68 * auVar16._0_4_;
  auVar189._4_4_ = fVar94 * auVar16._4_4_;
  auVar189._8_4_ = fVar92 * auVar16._8_4_;
  auVar189._12_4_ = fVar144 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar69,auVar69,0x55);
  auVar16 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar7,auVar16);
  auVar205._4_4_ = local_3f8._0_4_;
  auVar205._0_4_ = local_3f8._0_4_;
  auVar205._8_4_ = local_3f8._0_4_;
  auVar205._12_4_ = local_3f8._0_4_;
  aVar7 = pre->ray_space[k].vx.field_0;
  auVar97 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar7,auVar205);
  auVar206._4_4_ = local_408._0_4_;
  auVar206._0_4_ = local_408._0_4_;
  auVar206._8_4_ = local_408._0_4_;
  auVar206._12_4_ = local_408._0_4_;
  auVar98 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar206);
  uVar64 = auVar185._0_4_;
  auVar207._4_4_ = uVar64;
  auVar207._0_4_ = uVar64;
  auVar207._8_4_ = uVar64;
  auVar207._12_4_ = uVar64;
  auVar125 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar7,auVar207);
  uVar64 = auVar23._0_4_;
  auVar208._4_4_ = uVar64;
  auVar208._0_4_ = uVar64;
  auVar208._8_4_ = uVar64;
  auVar208._12_4_ = uVar64;
  auVar96 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar7,auVar208);
  uVar64 = auVar24._0_4_;
  auVar209._4_4_ = uVar64;
  auVar209._0_4_ = uVar64;
  auVar209._8_4_ = uVar64;
  auVar209._12_4_ = uVar64;
  auVar182 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar7,auVar209);
  uVar64 = auVar164._0_4_;
  auVar210._4_4_ = uVar64;
  auVar210._0_4_ = uVar64;
  auVar210._8_4_ = uVar64;
  auVar210._12_4_ = uVar64;
  auVar201 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar7,auVar210);
  uVar64 = auVar187._0_4_;
  auVar211._4_4_ = uVar64;
  auVar211._0_4_ = uVar64;
  auVar211._8_4_ = uVar64;
  auVar211._12_4_ = uVar64;
  auVar242 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar211);
  uVar64 = auVar69._0_4_;
  auVar212._4_4_ = uVar64;
  auVar212._0_4_ = uVar64;
  auVar212._8_4_ = uVar64;
  auVar212._12_4_ = uVar64;
  auVar243 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar7,auVar212);
  auVar21 = vmovlhps_avx(auVar97,auVar182);
  auVar22 = vmovlhps_avx(auVar98,auVar201);
  auVar186 = vmovlhps_avx(auVar125,auVar242);
  auVar18 = vmovlhps_avx(auVar96,auVar243);
  auVar16 = vminps_avx(auVar21,auVar22);
  auVar19 = vminps_avx(auVar186,auVar18);
  auVar20 = vminps_avx(auVar16,auVar19);
  auVar16 = vmaxps_avx(auVar21,auVar22);
  auVar19 = vmaxps_avx(auVar186,auVar18);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vshufpd_avx(auVar20,auVar20,3);
  auVar20 = vminps_avx(auVar20,auVar19);
  auVar19 = vshufpd_avx(auVar16,auVar16,3);
  auVar19 = vmaxps_avx(auVar16,auVar19);
  auVar16 = vandps_avx(local_3d8,auVar20);
  auVar19 = vandps_avx(auVar19,local_3d8);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar19,auVar16);
  fVar94 = auVar16._0_4_ * 9.536743e-07;
  auVar247._8_8_ = auVar97._0_8_;
  auVar247._0_8_ = auVar97._0_8_;
  auVar271._8_8_ = auVar98._0_8_;
  auVar271._0_8_ = auVar98._0_8_;
  auVar305._0_8_ = auVar125._0_8_;
  auVar305._8_8_ = auVar305._0_8_;
  auVar317._0_8_ = auVar96._0_8_;
  auVar317._8_8_ = auVar317._0_8_;
  local_3e8 = 0x80000000;
  uStack_3e4 = 0x80000000;
  uStack_3e0 = 0x80000000;
  uStack_3dc = 0x80000000;
  local_78 = fVar94;
  fStack_74 = fVar94;
  fStack_70 = fVar94;
  fStack_6c = fVar94;
  fStack_68 = fVar94;
  fStack_64 = fVar94;
  fStack_60 = fVar94;
  fStack_5c = fVar94;
  fStack_90 = -fVar94;
  local_98 = -fVar94;
  fStack_94 = -fVar94;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar66 = false;
  uVar62 = 0;
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  auVar19 = vsubps_avx(auVar22,auVar21);
  auVar20 = vsubps_avx(auVar186,auVar22);
  auVar70 = vsubps_avx(auVar18,auVar186);
  auVar97 = vsubps_avx(_local_438,local_418);
  auVar98 = vsubps_avx(auVar162,auVar146);
  auVar125 = vsubps_avx(_local_448,local_428);
  auVar96 = vsubps_avx(auVar163,auVar104);
  auVar76 = ZEXT816(0x3f80000000000000);
  auVar16 = auVar76;
LAB_0123cd2a:
  auVar256 = vshufps_avx(auVar76,auVar76,0x50);
  auVar327._8_4_ = 0x3f800000;
  auVar327._0_8_ = 0x3f8000003f800000;
  auVar327._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._0_16_ = auVar327;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar267 = vsubps_avx(auVar327,auVar256);
  fVar92 = auVar256._0_4_;
  fVar161 = auVar182._0_4_;
  auVar77._0_4_ = fVar161 * fVar92;
  fVar144 = auVar256._4_4_;
  fVar179 = auVar182._4_4_;
  auVar77._4_4_ = fVar179 * fVar144;
  fVar145 = auVar256._8_4_;
  auVar77._8_4_ = fVar161 * fVar145;
  fVar143 = auVar256._12_4_;
  auVar77._12_4_ = fVar179 * fVar143;
  fVar200 = auVar201._0_4_;
  auVar213._0_4_ = fVar200 * fVar92;
  fVar218 = auVar201._4_4_;
  auVar213._4_4_ = fVar218 * fVar144;
  auVar213._8_4_ = fVar200 * fVar145;
  auVar213._12_4_ = fVar218 * fVar143;
  fVar219 = auVar242._0_4_;
  auVar172._0_4_ = fVar219 * fVar92;
  fVar235 = auVar242._4_4_;
  auVar172._4_4_ = fVar235 * fVar144;
  auVar172._8_4_ = fVar219 * fVar145;
  auVar172._12_4_ = fVar235 * fVar143;
  fVar180 = auVar243._0_4_;
  auVar130._0_4_ = fVar180 * fVar92;
  fVar181 = auVar243._4_4_;
  auVar130._4_4_ = fVar181 * fVar144;
  auVar130._8_4_ = fVar180 * fVar145;
  auVar130._12_4_ = fVar181 * fVar143;
  auVar289 = vfmadd231ps_fma(auVar77,auVar267,auVar247);
  auVar192 = vfmadd231ps_fma(auVar213,auVar267,auVar271);
  auVar298 = vfmadd231ps_fma(auVar172,auVar267,auVar305);
  auVar284 = vfmadd231ps_fma(auVar130,auVar317,auVar267);
  auVar256 = vmovshdup_avx(auVar16);
  fVar92 = auVar16._0_4_;
  fStack_120 = (auVar256._0_4_ - fVar92) * 0.04761905;
  auVar266._4_4_ = fVar92;
  auVar266._0_4_ = fVar92;
  auVar266._8_4_ = fVar92;
  auVar266._12_4_ = fVar92;
  auVar266._16_4_ = fVar92;
  auVar266._20_4_ = fVar92;
  auVar266._24_4_ = fVar92;
  auVar266._28_4_ = fVar92;
  auVar120._0_8_ = auVar256._0_8_;
  auVar120._8_8_ = auVar120._0_8_;
  auVar120._16_8_ = auVar120._0_8_;
  auVar120._24_8_ = auVar120._0_8_;
  auVar89 = vsubps_avx(auVar120,auVar266);
  uVar64 = auVar289._0_4_;
  auVar321._4_4_ = uVar64;
  auVar321._0_4_ = uVar64;
  auVar321._8_4_ = uVar64;
  auVar321._12_4_ = uVar64;
  auVar321._16_4_ = uVar64;
  auVar321._20_4_ = uVar64;
  auVar321._24_4_ = uVar64;
  auVar321._28_4_ = uVar64;
  auVar256 = vmovshdup_avx(auVar289);
  uVar95 = auVar256._0_8_;
  auVar311._8_8_ = uVar95;
  auVar311._0_8_ = uVar95;
  auVar311._16_8_ = uVar95;
  auVar311._24_8_ = uVar95;
  fVar220 = auVar192._0_4_;
  auVar294._4_4_ = fVar220;
  auVar294._0_4_ = fVar220;
  auVar294._8_4_ = fVar220;
  auVar294._12_4_ = fVar220;
  auVar294._16_4_ = fVar220;
  auVar294._20_4_ = fVar220;
  auVar294._24_4_ = fVar220;
  auVar294._28_4_ = fVar220;
  auVar267 = vmovshdup_avx(auVar192);
  auVar121._0_8_ = auVar267._0_8_;
  auVar121._8_8_ = auVar121._0_8_;
  auVar121._16_8_ = auVar121._0_8_;
  auVar121._24_8_ = auVar121._0_8_;
  fVar142 = auVar298._0_4_;
  auVar232._4_4_ = fVar142;
  auVar232._0_4_ = fVar142;
  auVar232._8_4_ = fVar142;
  auVar232._12_4_ = fVar142;
  auVar232._16_4_ = fVar142;
  auVar232._20_4_ = fVar142;
  auVar232._24_4_ = fVar142;
  auVar232._28_4_ = fVar142;
  auVar268 = vmovshdup_avx(auVar298);
  auVar253._0_8_ = auVar268._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar253._16_8_ = auVar253._0_8_;
  auVar253._24_8_ = auVar253._0_8_;
  fVar141 = auVar284._0_4_;
  auVar269 = vmovshdup_avx(auVar284);
  auVar323 = vfmadd132ps_fma(auVar89,auVar266,_DAT_01f7b040);
  auVar89 = vsubps_avx(auVar331,ZEXT1632(auVar323));
  fVar92 = auVar323._0_4_;
  fVar144 = auVar323._4_4_;
  auVar25._4_4_ = fVar220 * fVar144;
  auVar25._0_4_ = fVar220 * fVar92;
  fVar145 = auVar323._8_4_;
  auVar25._8_4_ = fVar220 * fVar145;
  fVar143 = auVar323._12_4_;
  auVar25._12_4_ = fVar220 * fVar143;
  auVar25._16_4_ = fVar220 * 0.0;
  auVar25._20_4_ = fVar220 * 0.0;
  auVar25._24_4_ = fVar220 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar323 = vfmadd231ps_fma(auVar25,auVar89,auVar321);
  fVar124 = auVar267._0_4_;
  fVar140 = auVar267._4_4_;
  auVar26._4_4_ = fVar140 * fVar144;
  auVar26._0_4_ = fVar124 * fVar92;
  auVar26._8_4_ = fVar124 * fVar145;
  auVar26._12_4_ = fVar140 * fVar143;
  auVar26._16_4_ = fVar124 * 0.0;
  auVar26._20_4_ = fVar140 * 0.0;
  auVar26._24_4_ = fVar124 * 0.0;
  auVar26._28_4_ = uVar64;
  auVar328 = vfmadd231ps_fma(auVar26,auVar89,auVar311);
  auVar27._4_4_ = fVar142 * fVar144;
  auVar27._0_4_ = fVar142 * fVar92;
  auVar27._8_4_ = fVar142 * fVar145;
  auVar27._12_4_ = fVar142 * fVar143;
  auVar27._16_4_ = fVar142 * 0.0;
  auVar27._20_4_ = fVar142 * 0.0;
  auVar27._24_4_ = fVar142 * 0.0;
  auVar27._28_4_ = auVar256._4_4_;
  auVar153 = vfmadd231ps_fma(auVar27,auVar89,auVar294);
  fVar124 = auVar268._0_4_;
  fVar140 = auVar268._4_4_;
  auVar17._4_4_ = fVar140 * fVar144;
  auVar17._0_4_ = fVar124 * fVar92;
  auVar17._8_4_ = fVar124 * fVar145;
  auVar17._12_4_ = fVar140 * fVar143;
  auVar17._16_4_ = fVar124 * 0.0;
  auVar17._20_4_ = fVar140 * 0.0;
  auVar17._24_4_ = fVar124 * 0.0;
  auVar17._28_4_ = fVar220;
  auVar71 = vfmadd231ps_fma(auVar17,auVar89,auVar121);
  auVar256 = vshufps_avx(auVar289,auVar289,0xaa);
  uStack_560 = auVar256._0_8_;
  local_568 = (undefined1  [8])uStack_560;
  uStack_558 = uStack_560;
  uStack_550 = uStack_560;
  auVar267 = vshufps_avx(auVar289,auVar289,0xff);
  uStack_640 = auVar267._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar28._4_4_ = fVar141 * fVar144;
  auVar28._0_4_ = fVar141 * fVar92;
  auVar28._8_4_ = fVar141 * fVar145;
  auVar28._12_4_ = fVar141 * fVar143;
  auVar28._16_4_ = fVar141 * 0.0;
  auVar28._20_4_ = fVar141 * 0.0;
  auVar28._24_4_ = fVar141 * 0.0;
  auVar28._28_4_ = fVar141;
  auVar289 = vfmadd231ps_fma(auVar28,auVar89,auVar232);
  auVar267 = vshufps_avx(auVar192,auVar192,0xaa);
  auVar233._0_8_ = auVar267._0_8_;
  auVar233._8_8_ = auVar233._0_8_;
  auVar233._16_8_ = auVar233._0_8_;
  auVar233._24_8_ = auVar233._0_8_;
  auVar268 = vshufps_avx(auVar192,auVar192,0xff);
  uStack_510 = auVar268._0_8_;
  local_518 = (undefined1  [8])uStack_510;
  uStack_508 = uStack_510;
  uStack_500 = uStack_510;
  fVar124 = auVar269._0_4_;
  fVar140 = auVar269._4_4_;
  auVar29._4_4_ = fVar140 * fVar144;
  auVar29._0_4_ = fVar124 * fVar92;
  auVar29._8_4_ = fVar124 * fVar145;
  auVar29._12_4_ = fVar140 * fVar143;
  auVar29._16_4_ = fVar124 * 0.0;
  auVar29._20_4_ = fVar140 * 0.0;
  auVar29._24_4_ = fVar124 * 0.0;
  auVar29._28_4_ = auVar256._4_4_;
  auVar72 = vfmadd231ps_fma(auVar29,auVar89,auVar253);
  auVar30._28_4_ = fVar140;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar153._12_4_ * fVar143,
                          CONCAT48(auVar153._8_4_ * fVar145,
                                   CONCAT44(auVar153._4_4_ * fVar144,auVar153._0_4_ * fVar92))));
  auVar323 = vfmadd231ps_fma(auVar30,auVar89,ZEXT1632(auVar323));
  fVar124 = auVar268._4_4_;
  auVar31._28_4_ = fVar124;
  auVar31._0_28_ =
       ZEXT1628(CONCAT412(auVar71._12_4_ * fVar143,
                          CONCAT48(auVar71._8_4_ * fVar145,
                                   CONCAT44(auVar71._4_4_ * fVar144,auVar71._0_4_ * fVar92))));
  auVar328 = vfmadd231ps_fma(auVar31,auVar89,ZEXT1632(auVar328));
  auVar256 = vshufps_avx(auVar298,auVar298,0xaa);
  uVar95 = auVar256._0_8_;
  auVar217._8_8_ = uVar95;
  auVar217._0_8_ = uVar95;
  auVar217._16_8_ = uVar95;
  auVar217._24_8_ = uVar95;
  auVar269 = vshufps_avx(auVar298,auVar298,0xff);
  uVar95 = auVar269._0_8_;
  auVar332._8_8_ = uVar95;
  auVar332._0_8_ = uVar95;
  auVar332._16_8_ = uVar95;
  auVar332._24_8_ = uVar95;
  auVar298 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar289._12_4_ * fVar143,
                                                CONCAT48(auVar289._8_4_ * fVar145,
                                                         CONCAT44(auVar289._4_4_ * fVar144,
                                                                  auVar289._0_4_ * fVar92)))),
                             auVar89,ZEXT1632(auVar153));
  auVar289 = vshufps_avx(auVar284,auVar284,0xaa);
  auVar192 = vshufps_avx(auVar284,auVar284,0xff);
  auVar284 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar72._12_4_,
                                                CONCAT48(fVar145 * auVar72._8_4_,
                                                         CONCAT44(fVar144 * auVar72._4_4_,
                                                                  fVar92 * auVar72._0_4_)))),auVar89
                             ,ZEXT1632(auVar71));
  auVar153 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar298._12_4_,
                                                CONCAT48(fVar145 * auVar298._8_4_,
                                                         CONCAT44(fVar144 * auVar298._4_4_,
                                                                  fVar92 * auVar298._0_4_)))),
                             auVar89,ZEXT1632(auVar323));
  auVar25 = vsubps_avx(ZEXT1632(auVar298),ZEXT1632(auVar323));
  auVar298 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar284._12_4_,
                                                CONCAT48(fVar145 * auVar284._8_4_,
                                                         CONCAT44(fVar144 * auVar284._4_4_,
                                                                  fVar92 * auVar284._0_4_)))),
                             auVar89,ZEXT1632(auVar328));
  auVar26 = vsubps_avx(ZEXT1632(auVar284),ZEXT1632(auVar328));
  fStack_4dc = auVar26._28_4_;
  auVar295._0_4_ = fStack_120 * auVar25._0_4_ * 3.0;
  auVar295._4_4_ = fStack_120 * auVar25._4_4_ * 3.0;
  auVar295._8_4_ = fStack_120 * auVar25._8_4_ * 3.0;
  auVar295._12_4_ = fStack_120 * auVar25._12_4_ * 3.0;
  auVar295._16_4_ = fStack_120 * auVar25._16_4_ * 3.0;
  auVar295._20_4_ = fStack_120 * auVar25._20_4_ * 3.0;
  auVar295._24_4_ = fStack_120 * auVar25._24_4_ * 3.0;
  auVar295._28_4_ = 0;
  local_4f8._0_4_ = fStack_120 * auVar26._0_4_ * 3.0;
  local_4f8._4_4_ = fStack_120 * auVar26._4_4_ * 3.0;
  fStack_4f0 = fStack_120 * auVar26._8_4_ * 3.0;
  fStack_4ec = fStack_120 * auVar26._12_4_ * 3.0;
  fStack_4e8 = fStack_120 * auVar26._16_4_ * 3.0;
  fStack_4e4 = fStack_120 * auVar26._20_4_ * 3.0;
  fStack_4e0 = fStack_120 * auVar26._24_4_ * 3.0;
  fVar140 = auVar267._0_4_;
  fVar141 = auVar267._4_4_;
  auVar32._4_4_ = fVar141 * fVar144;
  auVar32._0_4_ = fVar140 * fVar92;
  auVar32._8_4_ = fVar140 * fVar145;
  auVar32._12_4_ = fVar141 * fVar143;
  auVar32._16_4_ = fVar140 * 0.0;
  auVar32._20_4_ = fVar141 * 0.0;
  auVar32._24_4_ = fVar140 * 0.0;
  auVar32._28_4_ = fStack_4dc;
  auVar267 = vfmadd231ps_fma(auVar32,auVar89,_local_568);
  fVar140 = auVar268._0_4_;
  auVar254._4_4_ = fVar124 * fVar144;
  auVar254._0_4_ = fVar140 * fVar92;
  auVar254._8_4_ = fVar140 * fVar145;
  auVar254._12_4_ = fVar124 * fVar143;
  auVar254._16_4_ = fVar140 * 0.0;
  auVar254._20_4_ = fVar124 * 0.0;
  auVar254._24_4_ = fVar140 * 0.0;
  auVar254._28_4_ = 0;
  auVar268 = vfmadd231ps_fma(auVar254,auVar89,_local_648);
  fVar124 = auVar256._0_4_;
  fVar140 = auVar256._4_4_;
  auVar296._4_4_ = fVar140 * fVar144;
  auVar296._0_4_ = fVar124 * fVar92;
  auVar296._8_4_ = fVar124 * fVar145;
  auVar296._12_4_ = fVar140 * fVar143;
  auVar296._16_4_ = fVar124 * 0.0;
  auVar296._20_4_ = fVar140 * 0.0;
  auVar296._24_4_ = fVar124 * 0.0;
  auVar296._28_4_ = auVar25._28_4_;
  auVar256 = vfmadd231ps_fma(auVar296,auVar89,auVar233);
  fVar124 = auVar269._0_4_;
  fVar142 = auVar269._4_4_;
  auVar34._4_4_ = fVar142 * fVar144;
  auVar34._0_4_ = fVar124 * fVar92;
  auVar34._8_4_ = fVar124 * fVar145;
  auVar34._12_4_ = fVar142 * fVar143;
  auVar34._16_4_ = fVar124 * 0.0;
  auVar34._20_4_ = fVar142 * 0.0;
  auVar34._24_4_ = fVar124 * 0.0;
  auVar34._28_4_ = fVar141;
  auVar269 = vfmadd231ps_fma(auVar34,auVar89,_local_518);
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar153));
  fVar124 = auVar289._0_4_;
  fVar140 = auVar289._4_4_;
  auVar35._4_4_ = fVar140 * fVar144;
  auVar35._0_4_ = fVar124 * fVar92;
  auVar35._8_4_ = fVar124 * fVar145;
  auVar35._12_4_ = fVar140 * fVar143;
  auVar35._16_4_ = fVar124 * 0.0;
  auVar35._20_4_ = fVar140 * 0.0;
  auVar35._24_4_ = fVar124 * 0.0;
  auVar35._28_4_ = fVar140;
  auVar289 = vfmadd231ps_fma(auVar35,auVar89,auVar217);
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar298));
  fVar124 = auVar192._0_4_;
  fVar140 = auVar192._4_4_;
  auVar36._4_4_ = fVar140 * fVar144;
  auVar36._0_4_ = fVar124 * fVar92;
  auVar36._8_4_ = fVar124 * fVar145;
  auVar36._12_4_ = fVar140 * fVar143;
  auVar36._16_4_ = fVar124 * 0.0;
  auVar36._20_4_ = fVar140 * 0.0;
  auVar36._24_4_ = fVar124 * 0.0;
  auVar36._28_4_ = fVar140;
  auVar192 = vfmadd231ps_fma(auVar36,auVar89,auVar332);
  auVar37._28_4_ = fVar142;
  auVar37._0_28_ =
       ZEXT1628(CONCAT412(auVar256._12_4_ * fVar143,
                          CONCAT48(auVar256._8_4_ * fVar145,
                                   CONCAT44(auVar256._4_4_ * fVar144,auVar256._0_4_ * fVar92))));
  auVar267 = vfmadd231ps_fma(auVar37,auVar89,ZEXT1632(auVar267));
  auVar268 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar269._12_4_,
                                                CONCAT48(fVar145 * auVar269._8_4_,
                                                         CONCAT44(fVar144 * auVar269._4_4_,
                                                                  fVar92 * auVar269._0_4_)))),
                             auVar89,ZEXT1632(auVar268));
  auVar122._0_4_ = auVar153._0_4_ + auVar295._0_4_;
  auVar122._4_4_ = auVar153._4_4_ + auVar295._4_4_;
  auVar122._8_4_ = auVar153._8_4_ + auVar295._8_4_;
  auVar122._12_4_ = auVar153._12_4_ + auVar295._12_4_;
  auVar122._16_4_ = auVar295._16_4_ + 0.0;
  auVar122._20_4_ = auVar295._20_4_ + 0.0;
  auVar122._24_4_ = auVar295._24_4_ + 0.0;
  auVar122._28_4_ = 0;
  auVar256 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar289._12_4_ * fVar143,
                                                CONCAT48(auVar289._8_4_ * fVar145,
                                                         CONCAT44(auVar289._4_4_ * fVar144,
                                                                  auVar289._0_4_ * fVar92)))),
                             auVar89,ZEXT1632(auVar256));
  auVar269 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * fVar143,
                                                CONCAT48(auVar192._8_4_ * fVar145,
                                                         CONCAT44(auVar192._4_4_ * fVar144,
                                                                  auVar192._0_4_ * fVar92)))),
                             auVar89,ZEXT1632(auVar269));
  auVar289 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar256._12_4_,
                                                CONCAT48(fVar145 * auVar256._8_4_,
                                                         CONCAT44(fVar144 * auVar256._4_4_,
                                                                  fVar92 * auVar256._0_4_)))),
                             auVar89,ZEXT1632(auVar267));
  auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar269._12_4_ * fVar143,
                                                CONCAT48(auVar269._8_4_ * fVar145,
                                                         CONCAT44(auVar269._4_4_ * fVar144,
                                                                  auVar269._0_4_ * fVar92)))),
                             ZEXT1632(auVar268),auVar89);
  auVar89 = vsubps_avx(ZEXT1632(auVar256),ZEXT1632(auVar267));
  auVar25 = vsubps_avx(ZEXT1632(auVar269),ZEXT1632(auVar268));
  auVar322._0_4_ = fStack_120 * auVar89._0_4_ * 3.0;
  auVar322._4_4_ = fStack_120 * auVar89._4_4_ * 3.0;
  auVar322._8_4_ = fStack_120 * auVar89._8_4_ * 3.0;
  auVar322._12_4_ = fStack_120 * auVar89._12_4_ * 3.0;
  auVar322._16_4_ = fStack_120 * auVar89._16_4_ * 3.0;
  auVar322._20_4_ = fStack_120 * auVar89._20_4_ * 3.0;
  auVar322._24_4_ = fStack_120 * auVar89._24_4_ * 3.0;
  auVar322._28_4_ = 0;
  local_138 = fStack_120 * auVar25._0_4_ * 3.0;
  fStack_134 = fStack_120 * auVar25._4_4_ * 3.0;
  auVar38._4_4_ = fStack_134;
  auVar38._0_4_ = local_138;
  fStack_130 = fStack_120 * auVar25._8_4_ * 3.0;
  auVar38._8_4_ = fStack_130;
  fStack_12c = fStack_120 * auVar25._12_4_ * 3.0;
  auVar38._12_4_ = fStack_12c;
  fStack_128 = fStack_120 * auVar25._16_4_ * 3.0;
  auVar38._16_4_ = fStack_128;
  fStack_124 = fStack_120 * auVar25._20_4_ * 3.0;
  auVar38._20_4_ = fStack_124;
  fStack_120 = fStack_120 * auVar25._24_4_ * 3.0;
  auVar38._24_4_ = fStack_120;
  auVar38._28_4_ = 0x40400000;
  auVar30 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar289));
  auVar31 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar192));
  auVar89 = vsubps_avx(ZEXT1632(auVar289),ZEXT1632(auVar153));
  auVar25 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar298));
  auVar26 = vsubps_avx(auVar30,auVar28);
  fVar220 = auVar89._0_4_ + auVar26._0_4_;
  fVar236 = auVar89._4_4_ + auVar26._4_4_;
  fVar237 = auVar89._8_4_ + auVar26._8_4_;
  fVar238 = auVar89._12_4_ + auVar26._12_4_;
  fVar239 = auVar89._16_4_ + auVar26._16_4_;
  fVar240 = auVar89._20_4_ + auVar26._20_4_;
  fVar241 = auVar89._24_4_ + auVar26._24_4_;
  auVar27 = vsubps_avx(auVar31,auVar29);
  auVar90._0_4_ = auVar25._0_4_ + auVar27._0_4_;
  auVar90._4_4_ = auVar25._4_4_ + auVar27._4_4_;
  auVar90._8_4_ = auVar25._8_4_ + auVar27._8_4_;
  auVar90._12_4_ = auVar25._12_4_ + auVar27._12_4_;
  auVar90._16_4_ = auVar25._16_4_ + auVar27._16_4_;
  auVar90._20_4_ = auVar25._20_4_ + auVar27._20_4_;
  auVar90._24_4_ = auVar25._24_4_ + auVar27._24_4_;
  auVar90._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  local_d8 = ZEXT1632(auVar298);
  fVar92 = auVar298._0_4_;
  local_158 = (float)local_4f8._0_4_ + fVar92;
  fVar144 = auVar298._4_4_;
  fStack_154 = (float)local_4f8._4_4_ + fVar144;
  fVar145 = auVar298._8_4_;
  fStack_150 = fStack_4f0 + fVar145;
  fVar143 = auVar298._12_4_;
  fStack_14c = fStack_4ec + fVar143;
  fStack_148 = fStack_4e8 + 0.0;
  fStack_144 = fStack_4e4 + 0.0;
  fStack_140 = fStack_4e0 + 0.0;
  auVar254 = ZEXT1632(auVar153);
  auVar25 = vsubps_avx(auVar254,auVar295);
  local_b8 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_d8,_local_4f8);
  local_178 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_f8._0_4_ = auVar289._0_4_ + auVar322._0_4_;
  local_f8._4_4_ = auVar289._4_4_ + auVar322._4_4_;
  local_f8._8_4_ = auVar289._8_4_ + auVar322._8_4_;
  local_f8._12_4_ = auVar289._12_4_ + auVar322._12_4_;
  local_f8._16_4_ = auVar322._16_4_ + 0.0;
  local_f8._20_4_ = auVar322._20_4_ + 0.0;
  local_f8._24_4_ = auVar322._24_4_ + 0.0;
  local_f8._28_4_ = 0;
  auVar296 = ZEXT1632(auVar289);
  auVar25 = vsubps_avx(auVar296,auVar322);
  auVar32 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar124 = auVar192._0_4_;
  local_138 = fVar124 + local_138;
  fVar140 = auVar192._4_4_;
  fStack_134 = fVar140 + fStack_134;
  fVar141 = auVar192._8_4_;
  fStack_130 = fVar141 + fStack_130;
  fVar142 = auVar192._12_4_;
  fStack_12c = fVar142 + fStack_12c;
  fStack_128 = fStack_128 + 0.0;
  fStack_124 = fStack_124 + 0.0;
  fStack_120 = fStack_120 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar192),auVar38);
  local_118 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar39._4_4_ = fVar144 * fVar236;
  auVar39._0_4_ = fVar92 * fVar220;
  auVar39._8_4_ = fVar145 * fVar237;
  auVar39._12_4_ = fVar143 * fVar238;
  auVar39._16_4_ = fVar239 * 0.0;
  auVar39._20_4_ = fVar240 * 0.0;
  auVar39._24_4_ = fVar241 * 0.0;
  auVar39._28_4_ = auVar25._28_4_;
  auVar256 = vfnmadd231ps_fma(auVar39,auVar254,auVar90);
  fStack_13c = fStack_4dc + 0.0;
  auVar40._4_4_ = fStack_154 * fVar236;
  auVar40._0_4_ = local_158 * fVar220;
  auVar40._8_4_ = fStack_150 * fVar237;
  auVar40._12_4_ = fStack_14c * fVar238;
  auVar40._16_4_ = fStack_148 * fVar239;
  auVar40._20_4_ = fStack_144 * fVar240;
  auVar40._24_4_ = fStack_140 * fVar241;
  auVar40._28_4_ = 0;
  auVar267 = vfnmadd231ps_fma(auVar40,auVar90,auVar122);
  auVar41._4_4_ = local_178._4_4_ * fVar236;
  auVar41._0_4_ = local_178._0_4_ * fVar220;
  auVar41._8_4_ = local_178._8_4_ * fVar237;
  auVar41._12_4_ = local_178._12_4_ * fVar238;
  auVar41._16_4_ = local_178._16_4_ * fVar239;
  auVar41._20_4_ = local_178._20_4_ * fVar240;
  auVar41._24_4_ = local_178._24_4_ * fVar241;
  auVar41._28_4_ = fStack_4dc + 0.0;
  auVar268 = vfnmadd231ps_fma(auVar41,local_b8,auVar90);
  local_648._0_4_ = auVar29._0_4_;
  local_648._4_4_ = auVar29._4_4_;
  uStack_640._0_4_ = auVar29._8_4_;
  uStack_640._4_4_ = auVar29._12_4_;
  uStack_638._0_4_ = auVar29._16_4_;
  uStack_638._4_4_ = auVar29._20_4_;
  uStack_630._0_4_ = auVar29._24_4_;
  uStack_630._4_4_ = auVar29._28_4_;
  auVar42._4_4_ = (float)local_648._4_4_ * fVar236;
  auVar42._0_4_ = (float)local_648._0_4_ * fVar220;
  auVar42._8_4_ = (float)uStack_640 * fVar237;
  auVar42._12_4_ = uStack_640._4_4_ * fVar238;
  auVar42._16_4_ = (float)uStack_638 * fVar239;
  auVar42._20_4_ = uStack_638._4_4_ * fVar240;
  auVar42._24_4_ = (float)uStack_630 * fVar241;
  auVar42._28_4_ = uStack_630._4_4_;
  auVar269 = vfnmadd231ps_fma(auVar42,auVar28,auVar90);
  auVar255._0_4_ = fVar124 * fVar220;
  auVar255._4_4_ = fVar140 * fVar236;
  auVar255._8_4_ = fVar141 * fVar237;
  auVar255._12_4_ = fVar142 * fVar238;
  auVar255._16_4_ = fVar239 * 0.0;
  auVar255._20_4_ = fVar240 * 0.0;
  auVar255._24_4_ = fVar241 * 0.0;
  auVar255._28_4_ = 0;
  auVar289 = vfnmadd231ps_fma(auVar255,auVar296,auVar90);
  uStack_11c = 0x40400000;
  auVar43._4_4_ = fStack_134 * fVar236;
  auVar43._0_4_ = local_138 * fVar220;
  auVar43._8_4_ = fStack_130 * fVar237;
  auVar43._12_4_ = fStack_12c * fVar238;
  auVar43._16_4_ = fStack_128 * fVar239;
  auVar43._20_4_ = fStack_124 * fVar240;
  auVar43._24_4_ = fStack_120 * fVar241;
  auVar43._28_4_ = auVar28._28_4_;
  auVar298 = vfnmadd231ps_fma(auVar43,local_f8,auVar90);
  auVar44._4_4_ = local_118._4_4_ * fVar236;
  auVar44._0_4_ = local_118._0_4_ * fVar220;
  auVar44._8_4_ = local_118._8_4_ * fVar237;
  auVar44._12_4_ = local_118._12_4_ * fVar238;
  auVar44._16_4_ = local_118._16_4_ * fVar239;
  auVar44._20_4_ = local_118._20_4_ * fVar240;
  auVar44._24_4_ = local_118._24_4_ * fVar241;
  auVar44._28_4_ = local_118._28_4_;
  auVar284 = vfnmadd231ps_fma(auVar44,auVar32,auVar90);
  auVar45._4_4_ = auVar31._4_4_ * fVar236;
  auVar45._0_4_ = auVar31._0_4_ * fVar220;
  auVar45._8_4_ = auVar31._8_4_ * fVar237;
  auVar45._12_4_ = auVar31._12_4_ * fVar238;
  auVar45._16_4_ = auVar31._16_4_ * fVar239;
  auVar45._20_4_ = auVar31._20_4_ * fVar240;
  auVar45._24_4_ = auVar31._24_4_ * fVar241;
  auVar45._28_4_ = auVar89._28_4_ + auVar26._28_4_;
  auVar323 = vfnmadd231ps_fma(auVar45,auVar30,auVar90);
  auVar25 = vminps_avx(ZEXT1632(auVar256),ZEXT1632(auVar267));
  auVar89 = vmaxps_avx(ZEXT1632(auVar256),ZEXT1632(auVar267));
  auVar26 = vminps_avx(ZEXT1632(auVar268),ZEXT1632(auVar269));
  auVar26 = vminps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(ZEXT1632(auVar268),ZEXT1632(auVar269));
  auVar89 = vmaxps_avx(auVar89,auVar25);
  auVar27 = vminps_avx(ZEXT1632(auVar289),ZEXT1632(auVar298));
  auVar25 = vmaxps_avx(ZEXT1632(auVar289),ZEXT1632(auVar298));
  auVar17 = vminps_avx(ZEXT1632(auVar284),ZEXT1632(auVar323));
  auVar27 = vminps_avx(auVar27,auVar17);
  auVar27 = vminps_avx(auVar26,auVar27);
  auVar26 = vmaxps_avx(ZEXT1632(auVar284),ZEXT1632(auVar323));
  auVar25 = vmaxps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(auVar89,auVar25);
  auVar54._4_4_ = fStack_74;
  auVar54._0_4_ = local_78;
  auVar54._8_4_ = fStack_70;
  auVar54._12_4_ = fStack_6c;
  auVar54._16_4_ = fStack_68;
  auVar54._20_4_ = fStack_64;
  auVar54._24_4_ = fStack_60;
  auVar54._28_4_ = fStack_5c;
  auVar89 = vcmpps_avx(auVar27,auVar54,2);
  auVar53._4_4_ = fStack_94;
  auVar53._0_4_ = local_98;
  auVar53._8_4_ = fStack_90;
  auVar53._12_4_ = fStack_8c;
  auVar53._16_4_ = fStack_88;
  auVar53._20_4_ = fStack_84;
  auVar53._24_4_ = fStack_80;
  auVar53._28_4_ = fStack_7c;
  auVar25 = vcmpps_avx(auVar25,auVar53,5);
  auVar89 = vandps_avx(auVar25,auVar89);
  auVar25 = local_198 & auVar89;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar28,auVar254);
    auVar26 = vsubps_avx(auVar30,auVar296);
    fVar236 = auVar25._0_4_ + auVar26._0_4_;
    fVar237 = auVar25._4_4_ + auVar26._4_4_;
    fVar238 = auVar25._8_4_ + auVar26._8_4_;
    fVar239 = auVar25._12_4_ + auVar26._12_4_;
    fVar240 = auVar25._16_4_ + auVar26._16_4_;
    fVar241 = auVar25._20_4_ + auVar26._20_4_;
    fVar93 = auVar25._24_4_ + auVar26._24_4_;
    auVar27 = vsubps_avx(auVar29,local_d8);
    auVar17 = vsubps_avx(auVar31,ZEXT1632(auVar192));
    auVar123._0_4_ = auVar27._0_4_ + auVar17._0_4_;
    auVar123._4_4_ = auVar27._4_4_ + auVar17._4_4_;
    auVar123._8_4_ = auVar27._8_4_ + auVar17._8_4_;
    auVar123._12_4_ = auVar27._12_4_ + auVar17._12_4_;
    auVar123._16_4_ = auVar27._16_4_ + auVar17._16_4_;
    auVar123._20_4_ = auVar27._20_4_ + auVar17._20_4_;
    auVar123._24_4_ = auVar27._24_4_ + auVar17._24_4_;
    fVar220 = auVar17._28_4_;
    auVar123._28_4_ = auVar27._28_4_ + fVar220;
    auVar46._4_4_ = fVar144 * fVar237;
    auVar46._0_4_ = fVar92 * fVar236;
    auVar46._8_4_ = fVar145 * fVar238;
    auVar46._12_4_ = fVar143 * fVar239;
    auVar46._16_4_ = fVar240 * 0.0;
    auVar46._20_4_ = fVar241 * 0.0;
    auVar46._24_4_ = fVar93 * 0.0;
    auVar46._28_4_ = auVar31._28_4_;
    auVar289 = vfnmadd231ps_fma(auVar46,auVar123,auVar254);
    auVar47._4_4_ = fVar237 * fStack_154;
    auVar47._0_4_ = fVar236 * local_158;
    auVar47._8_4_ = fVar238 * fStack_150;
    auVar47._12_4_ = fVar239 * fStack_14c;
    auVar47._16_4_ = fVar240 * fStack_148;
    auVar47._20_4_ = fVar241 * fStack_144;
    auVar47._24_4_ = fVar93 * fStack_140;
    auVar47._28_4_ = 0;
    auVar256 = vfnmadd213ps_fma(auVar122,auVar123,auVar47);
    auVar48._4_4_ = fVar237 * local_178._4_4_;
    auVar48._0_4_ = fVar236 * local_178._0_4_;
    auVar48._8_4_ = fVar238 * local_178._8_4_;
    auVar48._12_4_ = fVar239 * local_178._12_4_;
    auVar48._16_4_ = fVar240 * local_178._16_4_;
    auVar48._20_4_ = fVar241 * local_178._20_4_;
    auVar48._24_4_ = fVar93 * local_178._24_4_;
    auVar48._28_4_ = 0;
    auVar267 = vfnmadd213ps_fma(local_b8,auVar123,auVar48);
    auVar49._4_4_ = (float)local_648._4_4_ * fVar237;
    auVar49._0_4_ = (float)local_648._0_4_ * fVar236;
    auVar49._8_4_ = (float)uStack_640 * fVar238;
    auVar49._12_4_ = uStack_640._4_4_ * fVar239;
    auVar49._16_4_ = (float)uStack_638 * fVar240;
    auVar49._20_4_ = uStack_638._4_4_ * fVar241;
    auVar49._24_4_ = (float)uStack_630 * fVar93;
    auVar49._28_4_ = 0;
    auVar192 = vfnmadd231ps_fma(auVar49,auVar123,auVar28);
    auVar159._0_4_ = fVar124 * fVar236;
    auVar159._4_4_ = fVar140 * fVar237;
    auVar159._8_4_ = fVar141 * fVar238;
    auVar159._12_4_ = fVar142 * fVar239;
    auVar159._16_4_ = fVar240 * 0.0;
    auVar159._20_4_ = fVar241 * 0.0;
    auVar159._24_4_ = fVar93 * 0.0;
    auVar159._28_4_ = 0;
    auVar298 = vfnmadd231ps_fma(auVar159,auVar123,auVar296);
    auVar50._4_4_ = fVar237 * fStack_134;
    auVar50._0_4_ = fVar236 * local_138;
    auVar50._8_4_ = fVar238 * fStack_130;
    auVar50._12_4_ = fVar239 * fStack_12c;
    auVar50._16_4_ = fVar240 * fStack_128;
    auVar50._20_4_ = fVar241 * fStack_124;
    auVar50._24_4_ = fVar93 * fStack_120;
    auVar50._28_4_ = fVar220;
    auVar268 = vfnmadd213ps_fma(local_f8,auVar123,auVar50);
    auVar51._4_4_ = fVar237 * local_118._4_4_;
    auVar51._0_4_ = fVar236 * local_118._0_4_;
    auVar51._8_4_ = fVar238 * local_118._8_4_;
    auVar51._12_4_ = fVar239 * local_118._12_4_;
    auVar51._16_4_ = fVar240 * local_118._16_4_;
    auVar51._20_4_ = fVar241 * local_118._20_4_;
    auVar51._24_4_ = fVar93 * local_118._24_4_;
    auVar51._28_4_ = fVar220;
    auVar269 = vfnmadd213ps_fma(auVar32,auVar123,auVar51);
    auVar52._4_4_ = fVar237 * auVar31._4_4_;
    auVar52._0_4_ = fVar236 * auVar31._0_4_;
    auVar52._8_4_ = fVar238 * auVar31._8_4_;
    auVar52._12_4_ = fVar239 * auVar31._12_4_;
    auVar52._16_4_ = fVar240 * auVar31._16_4_;
    auVar52._20_4_ = fVar241 * auVar31._20_4_;
    auVar52._24_4_ = fVar93 * auVar31._24_4_;
    auVar52._28_4_ = auVar25._28_4_ + auVar26._28_4_;
    auVar284 = vfnmadd231ps_fma(auVar52,auVar123,auVar30);
    auVar26 = vminps_avx(ZEXT1632(auVar289),ZEXT1632(auVar256));
    auVar25 = vmaxps_avx(ZEXT1632(auVar289),ZEXT1632(auVar256));
    auVar27 = vminps_avx(ZEXT1632(auVar267),ZEXT1632(auVar192));
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar267),ZEXT1632(auVar192));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar17 = vminps_avx(ZEXT1632(auVar298),ZEXT1632(auVar268));
    auVar26 = vmaxps_avx(ZEXT1632(auVar298),ZEXT1632(auVar268));
    auVar28 = vminps_avx(ZEXT1632(auVar269),ZEXT1632(auVar284));
    auVar17 = vminps_avx(auVar17,auVar28);
    auVar17 = vminps_avx(auVar27,auVar17);
    auVar27 = vmaxps_avx(ZEXT1632(auVar269),ZEXT1632(auVar284));
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar17,auVar54,2);
    auVar26 = vcmpps_avx(auVar26,auVar53,5);
    auVar25 = vandps_avx(auVar26,auVar25);
    auVar89 = vandps_avx(auVar89,local_198);
    auVar26 = auVar89 & auVar25;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar89 = vandps_avx(auVar25,auVar89);
      uVar60 = vmovmskps_avx(auVar89);
      if (uVar60 != 0) {
        mask_stack[uVar62] = uVar60 & 0xff;
        BVar6 = (BBox1f)vmovlps_avx(auVar16);
        cu_stack[uVar62] = BVar6;
        BVar6 = (BBox1f)vmovlps_avx(auVar76);
        cv_stack[uVar62] = BVar6;
        uVar62 = (ulong)((int)uVar62 + 1);
      }
    }
  }
LAB_0123d2db:
  if ((int)uVar62 != 0) {
    uVar56 = (int)uVar62 - 1;
    uVar60 = mask_stack[uVar56];
    fVar92 = cu_stack[uVar56].lower;
    fVar144 = cu_stack[uVar56].upper;
    iVar33 = 0;
    for (uVar63 = (ulong)uVar60; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      iVar33 = iVar33 + 1;
    }
    uVar60 = uVar60 - 1 & uVar60;
    if (uVar60 == 0) {
      uVar62 = (ulong)uVar56;
    }
    auVar76._8_8_ = 0;
    auVar76._0_4_ = cv_stack[uVar56].lower;
    auVar76._4_4_ = cv_stack[uVar56].upper;
    mask_stack[uVar56] = uVar60;
    fVar145 = (float)(iVar33 + 1) * 0.14285715;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * (float)iVar33 * 0.14285715)),
                              ZEXT416((uint)fVar92),
                              ZEXT416((uint)(1.0 - (float)iVar33 * 0.14285715)));
    auVar256 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar145)),ZEXT416((uint)fVar92),
                               ZEXT416((uint)(1.0 - fVar145)));
    fVar144 = auVar256._0_4_;
    auVar234._0_4_ = auVar16._0_4_;
    fVar92 = fVar144 - auVar234._0_4_;
    if (fVar92 < 0.16666667) {
      auVar267 = vshufps_avx(auVar76,auVar76,0x50);
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = 0x3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar268 = vsubps_avx(auVar110,auVar267);
      fVar145 = auVar267._0_4_;
      auVar173._0_4_ = fVar145 * fVar161;
      fVar143 = auVar267._4_4_;
      auVar173._4_4_ = fVar143 * fVar179;
      fVar124 = auVar267._8_4_;
      auVar173._8_4_ = fVar124 * fVar161;
      fVar140 = auVar267._12_4_;
      auVar173._12_4_ = fVar140 * fVar179;
      auVar190._0_4_ = fVar145 * fVar200;
      auVar190._4_4_ = fVar143 * fVar218;
      auVar190._8_4_ = fVar124 * fVar200;
      auVar190._12_4_ = fVar140 * fVar218;
      auVar214._0_4_ = fVar145 * fVar219;
      auVar214._4_4_ = fVar143 * fVar235;
      auVar214._8_4_ = fVar124 * fVar219;
      auVar214._12_4_ = fVar140 * fVar235;
      auVar78._0_4_ = fVar145 * fVar180;
      auVar78._4_4_ = fVar143 * fVar181;
      auVar78._8_4_ = fVar124 * fVar180;
      auVar78._12_4_ = fVar140 * fVar181;
      auVar267 = vfmadd231ps_fma(auVar173,auVar268,auVar247);
      auVar269 = vfmadd231ps_fma(auVar190,auVar268,auVar271);
      auVar289 = vfmadd231ps_fma(auVar214,auVar268,auVar305);
      auVar268 = vfmadd231ps_fma(auVar78,auVar268,auVar317);
      auVar160._16_16_ = auVar267;
      auVar160._0_16_ = auVar267;
      auVar178._16_16_ = auVar269;
      auVar178._0_16_ = auVar269;
      auVar199._16_16_ = auVar289;
      auVar199._0_16_ = auVar289;
      auVar234._4_4_ = auVar234._0_4_;
      auVar234._8_4_ = auVar234._0_4_;
      auVar234._12_4_ = auVar234._0_4_;
      auVar234._20_4_ = fVar144;
      auVar234._16_4_ = fVar144;
      auVar234._24_4_ = fVar144;
      auVar234._28_4_ = fVar144;
      auVar89 = vsubps_avx(auVar178,auVar160);
      auVar269 = vfmadd213ps_fma(auVar89,auVar234,auVar160);
      auVar89 = vsubps_avx(auVar199,auVar178);
      auVar192 = vfmadd213ps_fma(auVar89,auVar234,auVar178);
      auVar267 = vsubps_avx(auVar268,auVar289);
      auVar91._16_16_ = auVar267;
      auVar91._0_16_ = auVar267;
      auVar267 = vfmadd213ps_fma(auVar91,auVar234,auVar199);
      auVar89 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar269));
      auVar268 = vfmadd213ps_fma(auVar89,auVar234,ZEXT1632(auVar269));
      auVar89 = vsubps_avx(ZEXT1632(auVar267),ZEXT1632(auVar192));
      auVar267 = vfmadd213ps_fma(auVar89,auVar234,ZEXT1632(auVar192));
      auVar89 = vsubps_avx(ZEXT1632(auVar267),ZEXT1632(auVar268));
      auVar323 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar89,auVar234);
      fVar145 = fVar92 * 0.33333334;
      auVar229._0_8_ =
           CONCAT44(auVar323._4_4_ + fVar145 * auVar89._4_4_ * 3.0,
                    auVar323._0_4_ + fVar145 * auVar89._0_4_ * 3.0);
      auVar229._8_4_ = auVar323._8_4_ + fVar145 * auVar89._8_4_ * 3.0;
      auVar229._12_4_ = auVar323._12_4_ + fVar145 * auVar89._12_4_ * 3.0;
      auVar268 = vshufpd_avx(auVar323,auVar323,3);
      auVar269 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar267 = vsubps_avx(auVar268,auVar323);
      auVar289 = vsubps_avx(auVar269,(undefined1  [16])0x0);
      auVar79._0_4_ = auVar267._0_4_ + auVar289._0_4_;
      auVar79._4_4_ = auVar267._4_4_ + auVar289._4_4_;
      auVar79._8_4_ = auVar267._8_4_ + auVar289._8_4_;
      auVar79._12_4_ = auVar267._12_4_ + auVar289._12_4_;
      auVar267 = vshufps_avx(auVar323,auVar323,0xb1);
      auVar289 = vshufps_avx(auVar229,auVar229,0xb1);
      auVar318._4_4_ = auVar79._0_4_;
      auVar318._0_4_ = auVar79._0_4_;
      auVar318._8_4_ = auVar79._0_4_;
      auVar318._12_4_ = auVar79._0_4_;
      auVar192 = vshufps_avx(auVar79,auVar79,0x55);
      fVar143 = auVar192._0_4_;
      auVar80._0_4_ = fVar143 * auVar267._0_4_;
      fVar124 = auVar192._4_4_;
      auVar80._4_4_ = fVar124 * auVar267._4_4_;
      fVar140 = auVar192._8_4_;
      auVar80._8_4_ = fVar140 * auVar267._8_4_;
      fVar141 = auVar192._12_4_;
      auVar80._12_4_ = fVar141 * auVar267._12_4_;
      auVar191._0_4_ = fVar143 * auVar289._0_4_;
      auVar191._4_4_ = fVar124 * auVar289._4_4_;
      auVar191._8_4_ = fVar140 * auVar289._8_4_;
      auVar191._12_4_ = fVar141 * auVar289._12_4_;
      auVar298 = vfmadd231ps_fma(auVar80,auVar318,auVar323);
      auVar284 = vfmadd231ps_fma(auVar191,auVar318,auVar229);
      auVar289 = vshufps_avx(auVar298,auVar298,0xe8);
      auVar192 = vshufps_avx(auVar284,auVar284,0xe8);
      auVar267 = vcmpps_avx(auVar289,auVar192,1);
      uVar60 = vextractps_avx(auVar267,0);
      auVar328 = auVar284;
      if ((uVar60 & 1) == 0) {
        auVar328 = auVar298;
      }
      auVar152._0_4_ = fVar145 * auVar89._16_4_ * 3.0;
      auVar152._4_4_ = fVar145 * auVar89._20_4_ * 3.0;
      auVar152._8_4_ = fVar145 * auVar89._24_4_ * 3.0;
      auVar152._12_4_ = fVar145 * 0.0;
      auVar73 = vsubps_avx((undefined1  [16])0x0,auVar152);
      auVar153 = vshufps_avx(auVar73,auVar73,0xb1);
      auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar230._0_4_ = fVar143 * auVar153._0_4_;
      auVar230._4_4_ = fVar124 * auVar153._4_4_;
      auVar230._8_4_ = fVar140 * auVar153._8_4_;
      auVar230._12_4_ = fVar141 * auVar153._12_4_;
      auVar248._0_4_ = auVar71._0_4_ * fVar143;
      auVar248._4_4_ = auVar71._4_4_ * fVar124;
      auVar248._8_4_ = auVar71._8_4_ * fVar140;
      auVar248._12_4_ = auVar71._12_4_ * fVar141;
      auVar74 = vfmadd231ps_fma(auVar230,auVar318,auVar73);
      auVar75 = vfmadd231ps_fma(auVar248,(undefined1  [16])0x0,auVar318);
      auVar71 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar72 = vshufps_avx(auVar75,auVar75,0xe8);
      auVar153 = vcmpps_avx(auVar71,auVar72,1);
      uVar60 = vextractps_avx(auVar153,0);
      auVar99 = auVar75;
      if ((uVar60 & 1) == 0) {
        auVar99 = auVar74;
      }
      auVar328 = vmaxss_avx(auVar99,auVar328);
      auVar289 = vminps_avx(auVar289,auVar192);
      auVar192 = vminps_avx(auVar71,auVar72);
      auVar192 = vminps_avx(auVar289,auVar192);
      auVar267 = vshufps_avx(auVar267,auVar267,0x55);
      auVar267 = vblendps_avx(auVar267,auVar153,2);
      auVar153 = vpslld_avx(auVar267,0x1f);
      auVar267 = vshufpd_avx(auVar284,auVar284,1);
      auVar267 = vinsertps_avx(auVar267,auVar75,0x9c);
      auVar289 = vshufpd_avx(auVar298,auVar298,1);
      auVar289 = vinsertps_avx(auVar289,auVar74,0x9c);
      auVar267 = vblendvps_avx(auVar289,auVar267,auVar153);
      auVar289 = vmovshdup_avx(auVar267);
      auVar267 = vmaxss_avx(auVar289,auVar267);
      fVar140 = auVar192._0_4_;
      auVar289 = vmovshdup_avx(auVar192);
      fVar124 = auVar267._0_4_;
      fVar145 = auVar289._0_4_;
      fVar143 = auVar328._0_4_;
      if (((0.0001 <= fVar140) || (fVar124 <= -0.0001)) && (0.0001 <= fVar145 || fVar124 <= -0.0001)
         ) goto code_r0x0123d5e6;
      goto LAB_0123d60c;
    }
    auVar16 = vinsertps_avx(auVar16,auVar256,0x10);
    goto LAB_0123cd2a;
  }
  if (bVar66) goto LAB_0123e188;
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar64;
  auVar88._0_4_ = uVar64;
  auVar88._8_4_ = uVar64;
  auVar88._12_4_ = uVar64;
  auVar16 = vcmpps_avx(auVar221,auVar88,2);
  uVar57 = vmovmskps_avx(auVar16);
  uVar58 = (ulong)((uint)uVar58 & (uint)uVar58 + 0xf & uVar57);
  goto LAB_0123c05a;
code_r0x0123d5e6:
  auVar289 = vcmpps_avx(auVar289,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar298 = vcmpps_avx(auVar192,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar289 = vandps_avx(auVar298,auVar289);
  if (fVar143 <= -0.0001 || (auVar289 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0123d2db;
LAB_0123d60c:
  auVar298 = vcmpps_avx(auVar192,_DAT_01f45a50,1);
  auVar284 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar289 = vcmpss_avx(auVar328,ZEXT816(0) << 0x20,1);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar131._8_4_ = 0xbf800000;
  auVar131._0_8_ = 0xbf800000bf800000;
  auVar131._12_4_ = 0xbf800000;
  auVar289 = vblendvps_avx(auVar111,auVar131,auVar289);
  auVar298 = vblendvps_avx(auVar111,auVar131,auVar298);
  fVar142 = auVar298._0_4_;
  fVar141 = auVar289._0_4_;
  auVar289 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar142 == fVar141) && (!NAN(fVar142) && !NAN(fVar141))) {
    auVar289 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar142 == fVar141) && (!NAN(fVar142) && !NAN(fVar141))) {
    auVar284 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar298 = vmovshdup_avx(auVar298);
  fVar220 = auVar298._0_4_;
  if ((fVar142 != fVar220) || (NAN(fVar142) || NAN(fVar220))) {
    if ((fVar145 != fVar140) || (NAN(fVar145) || NAN(fVar140))) {
      auVar154._0_4_ = (float)((uint)fVar140 ^ local_3e8);
      auVar154._4_4_ = auVar192._4_4_ ^ uStack_3e4;
      auVar154._8_4_ = auVar192._8_4_ ^ uStack_3e0;
      auVar154._12_4_ = auVar192._12_4_ ^ uStack_3dc;
      auVar155._0_4_ = auVar154._0_4_ / (fVar145 - fVar140);
      auVar155._4_12_ = auVar154._4_12_;
      auVar192 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar155._0_4_)),auVar155,ZEXT416(0));
      auVar298 = auVar192;
    }
    else {
      auVar192 = ZEXT816(0) << 0x20;
      if ((fVar140 != 0.0) || (auVar298 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar140))) {
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
        auVar298 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar289 = vminss_avx(auVar289,auVar192);
    auVar284 = vmaxss_avx(auVar298,auVar284);
  }
  auVar267 = vcmpss_avx(auVar267,ZEXT416(0),1);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = 0x3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar132._8_4_ = 0xbf800000;
  auVar132._0_8_ = 0xbf800000bf800000;
  auVar132._12_4_ = 0xbf800000;
  auVar267 = vblendvps_avx(auVar112,auVar132,auVar267);
  fVar145 = auVar267._0_4_;
  if ((fVar141 != fVar145) || (NAN(fVar141) || NAN(fVar145))) {
    if ((fVar124 != fVar143) || (NAN(fVar124) || NAN(fVar143))) {
      auVar81._0_4_ = (float)((uint)fVar143 ^ local_3e8);
      auVar81._4_4_ = auVar328._4_4_ ^ uStack_3e4;
      auVar81._8_4_ = auVar328._8_4_ ^ uStack_3e0;
      auVar81._12_4_ = auVar328._12_4_ ^ uStack_3dc;
      auVar156._0_4_ = auVar81._0_4_ / (fVar124 - fVar143);
      auVar156._4_12_ = auVar81._4_12_;
      auVar267 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
      auVar192 = auVar267;
    }
    else {
      auVar267 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar143 != 0.0) || (auVar192 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar143))) {
        auVar267 = SUB6416(ZEXT464(0xff800000),0);
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar289 = vminss_avx(auVar289,auVar192);
    auVar284 = vmaxss_avx(auVar267,auVar284);
  }
  if ((fVar220 != fVar145) || (NAN(fVar220) || NAN(fVar145))) {
    auVar289 = vminss_avx(auVar289,SUB6416(ZEXT464(0x3f800000),0));
    auVar284 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar284);
  }
  auVar267 = vmaxss_avx(ZEXT816(0) << 0x40,auVar289);
  auVar289 = vminss_avx(auVar284,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar289._0_4_ < auVar267._0_4_) goto LAB_0123d2db;
  auVar267 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar267._0_4_ + -0.1)));
  auVar289 = vminss_avx(ZEXT416((uint)(auVar289._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar174._0_8_ = auVar323._0_8_;
  auVar174._8_8_ = auVar174._0_8_;
  auVar259._8_8_ = auVar229._0_8_;
  auVar259._0_8_ = auVar229._0_8_;
  auVar272._8_8_ = auVar73._0_8_;
  auVar272._0_8_ = auVar73._0_8_;
  auVar192 = vshufpd_avx(auVar229,auVar229,3);
  auVar298 = vshufpd_avx(auVar73,auVar73,3);
  auVar284 = vshufps_avx(auVar267,auVar289,0);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = 0x3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar323 = vsubps_avx(auVar82,auVar284);
  local_4d8 = auVar268._0_4_;
  fStack_4d4 = auVar268._4_4_;
  fStack_4d0 = auVar268._8_4_;
  fStack_4cc = auVar268._12_4_;
  fVar145 = auVar284._0_4_;
  auVar83._0_4_ = fVar145 * local_4d8;
  fVar143 = auVar284._4_4_;
  auVar83._4_4_ = fVar143 * fStack_4d4;
  fVar124 = auVar284._8_4_;
  auVar83._8_4_ = fVar124 * fStack_4d0;
  fVar140 = auVar284._12_4_;
  auVar83._12_4_ = fVar140 * fStack_4cc;
  auVar215._0_4_ = fVar145 * auVar192._0_4_;
  auVar215._4_4_ = fVar143 * auVar192._4_4_;
  auVar215._8_4_ = fVar124 * auVar192._8_4_;
  auVar215._12_4_ = fVar140 * auVar192._12_4_;
  auVar231._0_4_ = fVar145 * auVar298._0_4_;
  auVar231._4_4_ = fVar143 * auVar298._4_4_;
  auVar231._8_4_ = fVar124 * auVar298._8_4_;
  auVar231._12_4_ = fVar140 * auVar298._12_4_;
  local_538 = auVar269._0_4_;
  fStack_534 = auVar269._4_4_;
  fStack_530 = auVar269._8_4_;
  fStack_52c = auVar269._12_4_;
  auVar249._0_4_ = fVar145 * local_538;
  auVar249._4_4_ = fVar143 * fStack_534;
  auVar249._8_4_ = fVar124 * fStack_530;
  auVar249._12_4_ = fVar140 * fStack_52c;
  auVar192 = vfmadd231ps_fma(auVar83,auVar323,auVar174);
  auVar298 = vfmadd231ps_fma(auVar215,auVar323,auVar259);
  auVar284 = vfmadd231ps_fma(auVar231,auVar323,auVar272);
  auVar323 = vfmadd231ps_fma(auVar249,auVar323,ZEXT816(0));
  auVar268 = vmovshdup_avx(auVar76);
  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ * auVar267._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar267._0_4_)));
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ * auVar289._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar289._0_4_)));
  fVar145 = 1.0 / fVar92;
  auVar267 = vsubps_avx(auVar298,auVar192);
  auVar260._0_4_ = auVar267._0_4_ * 3.0;
  auVar260._4_4_ = auVar267._4_4_ * 3.0;
  auVar260._8_4_ = auVar267._8_4_ * 3.0;
  auVar260._12_4_ = auVar267._12_4_ * 3.0;
  auVar267 = vsubps_avx(auVar284,auVar298);
  auVar273._0_4_ = auVar267._0_4_ * 3.0;
  auVar273._4_4_ = auVar267._4_4_ * 3.0;
  auVar273._8_4_ = auVar267._8_4_ * 3.0;
  auVar273._12_4_ = auVar267._12_4_ * 3.0;
  auVar267 = vsubps_avx(auVar323,auVar284);
  auVar285._0_4_ = auVar267._0_4_ * 3.0;
  auVar285._4_4_ = auVar267._4_4_ * 3.0;
  auVar285._8_4_ = auVar267._8_4_ * 3.0;
  auVar285._12_4_ = auVar267._12_4_ * 3.0;
  auVar268 = vminps_avx(auVar273,auVar285);
  auVar267 = vmaxps_avx(auVar273,auVar285);
  auVar268 = vminps_avx(auVar260,auVar268);
  auVar267 = vmaxps_avx(auVar260,auVar267);
  auVar269 = vshufpd_avx(auVar268,auVar268,3);
  auVar289 = vshufpd_avx(auVar267,auVar267,3);
  auVar268 = vminps_avx(auVar268,auVar269);
  auVar267 = vmaxps_avx(auVar267,auVar289);
  auVar274._0_4_ = auVar268._0_4_ * fVar145;
  auVar274._4_4_ = auVar268._4_4_ * fVar145;
  auVar274._8_4_ = auVar268._8_4_ * fVar145;
  auVar274._12_4_ = auVar268._12_4_ * fVar145;
  auVar261._0_4_ = auVar267._0_4_ * fVar145;
  auVar261._4_4_ = auVar267._4_4_ * fVar145;
  auVar261._8_4_ = auVar267._8_4_ * fVar145;
  auVar261._12_4_ = auVar267._12_4_ * fVar145;
  fVar145 = 1.0 / (auVar73._0_4_ - auVar72._0_4_);
  auVar267 = vshufpd_avx(auVar192,auVar192,3);
  auVar268 = vshufpd_avx(auVar298,auVar298,3);
  auVar269 = vshufpd_avx(auVar284,auVar284,3);
  auVar289 = vshufpd_avx(auVar323,auVar323,3);
  auVar267 = vsubps_avx(auVar267,auVar192);
  auVar192 = vsubps_avx(auVar268,auVar298);
  auVar298 = vsubps_avx(auVar269,auVar284);
  auVar289 = vsubps_avx(auVar289,auVar323);
  auVar268 = vminps_avx(auVar267,auVar192);
  auVar267 = vmaxps_avx(auVar267,auVar192);
  auVar269 = vminps_avx(auVar298,auVar289);
  auVar269 = vminps_avx(auVar268,auVar269);
  auVar268 = vmaxps_avx(auVar298,auVar289);
  auVar267 = vmaxps_avx(auVar267,auVar268);
  auVar306._0_4_ = fVar145 * auVar269._0_4_;
  auVar306._4_4_ = fVar145 * auVar269._4_4_;
  auVar306._8_4_ = fVar145 * auVar269._8_4_;
  auVar306._12_4_ = fVar145 * auVar269._12_4_;
  auVar290._0_4_ = fVar145 * auVar267._0_4_;
  auVar290._4_4_ = fVar145 * auVar267._4_4_;
  auVar290._8_4_ = fVar145 * auVar267._8_4_;
  auVar290._12_4_ = fVar145 * auVar267._12_4_;
  auVar289 = vinsertps_avx(auVar16,auVar72,0x10);
  auVar192 = vinsertps_avx(auVar256,auVar73,0x10);
  auVar286._0_4_ = (auVar289._0_4_ + auVar192._0_4_) * 0.5;
  auVar286._4_4_ = (auVar289._4_4_ + auVar192._4_4_) * 0.5;
  auVar286._8_4_ = (auVar289._8_4_ + auVar192._8_4_) * 0.5;
  auVar286._12_4_ = (auVar289._12_4_ + auVar192._12_4_) * 0.5;
  auVar84._4_4_ = auVar286._0_4_;
  auVar84._0_4_ = auVar286._0_4_;
  auVar84._8_4_ = auVar286._0_4_;
  auVar84._12_4_ = auVar286._0_4_;
  auVar267 = vfmadd213ps_fma(auVar19,auVar84,auVar21);
  auVar268 = vfmadd213ps_fma(auVar20,auVar84,auVar22);
  auVar269 = vfmadd213ps_fma(auVar70,auVar84,auVar186);
  auVar256 = vsubps_avx(auVar268,auVar267);
  auVar267 = vfmadd213ps_fma(auVar256,auVar84,auVar267);
  auVar256 = vsubps_avx(auVar269,auVar268);
  auVar256 = vfmadd213ps_fma(auVar256,auVar84,auVar268);
  auVar256 = vsubps_avx(auVar256,auVar267);
  auVar267 = vfmadd231ps_fma(auVar267,auVar256,auVar84);
  auVar85._0_8_ = CONCAT44(auVar256._4_4_ * 3.0,auVar256._0_4_ * 3.0);
  auVar85._8_4_ = auVar256._8_4_ * 3.0;
  auVar85._12_4_ = auVar256._12_4_ * 3.0;
  auVar319._8_8_ = auVar267._0_8_;
  auVar319._0_8_ = auVar267._0_8_;
  auVar256 = vshufpd_avx(auVar267,auVar267,3);
  auVar267 = vshufps_avx(auVar286,auVar286,0x55);
  auVar284 = vsubps_avx(auVar256,auVar319);
  auVar76 = vfmadd231ps_fma(auVar319,auVar267,auVar284);
  auVar329._8_8_ = auVar85._0_8_;
  auVar329._0_8_ = auVar85._0_8_;
  auVar256 = vshufpd_avx(auVar85,auVar85,3);
  auVar256 = vsubps_avx(auVar256,auVar329);
  auVar323 = vfmadd213ps_fma(auVar256,auVar267,auVar329);
  auVar267 = vmovshdup_avx(auVar323);
  auVar330._0_8_ = auVar267._0_8_ ^ 0x8000000080000000;
  auVar330._8_4_ = auVar267._8_4_ ^ 0x80000000;
  auVar330._12_4_ = auVar267._12_4_ ^ 0x80000000;
  auVar268 = vmovshdup_avx(auVar284);
  auVar256 = vunpcklps_avx(auVar268,auVar330);
  auVar269 = vshufps_avx(auVar256,auVar330,4);
  auVar298 = vshufps_avx(auVar286,auVar286,0x54);
  auVar157._0_8_ = auVar284._0_8_ ^ 0x8000000080000000;
  auVar157._8_4_ = auVar284._8_4_ ^ 0x80000000;
  auVar157._12_4_ = auVar284._12_4_ ^ 0x80000000;
  auVar256 = vmovlhps_avx(auVar157,auVar323);
  auVar256 = vshufps_avx(auVar256,auVar323,8);
  auVar267 = vfmsub231ss_fma(ZEXT416((uint)(auVar284._0_4_ * auVar267._0_4_)),auVar268,auVar323);
  uVar64 = auVar267._0_4_;
  auVar86._4_4_ = uVar64;
  auVar86._0_4_ = uVar64;
  auVar86._8_4_ = uVar64;
  auVar86._12_4_ = uVar64;
  auVar267 = vdivps_avx(auVar269,auVar86);
  auVar268 = vdivps_avx(auVar256,auVar86);
  fVar124 = auVar76._0_4_;
  fVar145 = auVar267._0_4_;
  auVar256 = vshufps_avx(auVar76,auVar76,0x55);
  fVar143 = auVar268._0_4_;
  auVar87._0_4_ = fVar124 * fVar145 + auVar256._0_4_ * fVar143;
  auVar87._4_4_ = fVar124 * auVar267._4_4_ + auVar256._4_4_ * auVar268._4_4_;
  auVar87._8_4_ = fVar124 * auVar267._8_4_ + auVar256._8_4_ * auVar268._8_4_;
  auVar87._12_4_ = fVar124 * auVar267._12_4_ + auVar256._12_4_ * auVar268._12_4_;
  auVar71 = vsubps_avx(auVar298,auVar87);
  auVar298 = vmovshdup_avx(auVar267);
  auVar256 = vinsertps_avx(auVar274,auVar306,0x1c);
  auVar193._0_4_ = auVar298._0_4_ * auVar256._0_4_;
  auVar193._4_4_ = auVar298._4_4_ * auVar256._4_4_;
  auVar193._8_4_ = auVar298._8_4_ * auVar256._8_4_;
  auVar193._12_4_ = auVar298._12_4_ * auVar256._12_4_;
  auVar269 = vinsertps_avx(auVar261,auVar290,0x1c);
  auVar113._0_4_ = auVar269._0_4_ * auVar298._0_4_;
  auVar113._4_4_ = auVar269._4_4_ * auVar298._4_4_;
  auVar113._8_4_ = auVar269._8_4_ * auVar298._8_4_;
  auVar113._12_4_ = auVar269._12_4_ * auVar298._12_4_;
  auVar76 = vminps_avx(auVar193,auVar113);
  auVar323 = vmaxps_avx(auVar113,auVar193);
  auVar298 = vinsertps_avx(auVar306,auVar274,0x4c);
  auVar328 = vmovshdup_avx(auVar268);
  auVar284 = vinsertps_avx(auVar290,auVar261,0x4c);
  auVar291._0_4_ = auVar328._0_4_ * auVar298._0_4_;
  auVar291._4_4_ = auVar328._4_4_ * auVar298._4_4_;
  auVar291._8_4_ = auVar328._8_4_ * auVar298._8_4_;
  auVar291._12_4_ = auVar328._12_4_ * auVar298._12_4_;
  auVar275._0_4_ = auVar328._0_4_ * auVar284._0_4_;
  auVar275._4_4_ = auVar328._4_4_ * auVar284._4_4_;
  auVar275._8_4_ = auVar328._8_4_ * auVar284._8_4_;
  auVar275._12_4_ = auVar328._12_4_ * auVar284._12_4_;
  auVar328 = vminps_avx(auVar291,auVar275);
  auVar307._0_4_ = auVar76._0_4_ + auVar328._0_4_;
  auVar307._4_4_ = auVar76._4_4_ + auVar328._4_4_;
  auVar307._8_4_ = auVar76._8_4_ + auVar328._8_4_;
  auVar307._12_4_ = auVar76._12_4_ + auVar328._12_4_;
  auVar76 = vmaxps_avx(auVar275,auVar291);
  auVar114._0_4_ = auVar76._0_4_ + auVar323._0_4_;
  auVar114._4_4_ = auVar76._4_4_ + auVar323._4_4_;
  auVar114._8_4_ = auVar76._8_4_ + auVar323._8_4_;
  auVar114._12_4_ = auVar76._12_4_ + auVar323._12_4_;
  auVar276._8_8_ = 0x3f80000000000000;
  auVar276._0_8_ = 0x3f80000000000000;
  auVar323 = vsubps_avx(auVar276,auVar114);
  auVar76 = vsubps_avx(auVar276,auVar307);
  auVar328 = vsubps_avx(auVar289,auVar286);
  auVar153 = vsubps_avx(auVar192,auVar286);
  auVar133._0_4_ = fVar145 * auVar256._0_4_;
  auVar133._4_4_ = fVar145 * auVar256._4_4_;
  auVar133._8_4_ = fVar145 * auVar256._8_4_;
  auVar133._12_4_ = fVar145 * auVar256._12_4_;
  auVar308._0_4_ = fVar145 * auVar269._0_4_;
  auVar308._4_4_ = fVar145 * auVar269._4_4_;
  auVar308._8_4_ = fVar145 * auVar269._8_4_;
  auVar308._12_4_ = fVar145 * auVar269._12_4_;
  auVar269 = vminps_avx(auVar133,auVar308);
  auVar256 = vmaxps_avx(auVar308,auVar133);
  auVar194._0_4_ = fVar143 * auVar298._0_4_;
  auVar194._4_4_ = fVar143 * auVar298._4_4_;
  auVar194._8_4_ = fVar143 * auVar298._8_4_;
  auVar194._12_4_ = fVar143 * auVar298._12_4_;
  auVar262._0_4_ = fVar143 * auVar284._0_4_;
  auVar262._4_4_ = fVar143 * auVar284._4_4_;
  auVar262._8_4_ = fVar143 * auVar284._8_4_;
  auVar262._12_4_ = fVar143 * auVar284._12_4_;
  auVar298 = vminps_avx(auVar194,auVar262);
  auVar309._0_4_ = auVar269._0_4_ + auVar298._0_4_;
  auVar309._4_4_ = auVar269._4_4_ + auVar298._4_4_;
  auVar309._8_4_ = auVar269._8_4_ + auVar298._8_4_;
  auVar309._12_4_ = auVar269._12_4_ + auVar298._12_4_;
  fVar220 = auVar328._0_4_;
  auVar320._0_4_ = fVar220 * auVar323._0_4_;
  fVar236 = auVar328._4_4_;
  auVar320._4_4_ = fVar236 * auVar323._4_4_;
  fVar237 = auVar328._8_4_;
  auVar320._8_4_ = fVar237 * auVar323._8_4_;
  fVar238 = auVar328._12_4_;
  auVar320._12_4_ = fVar238 * auVar323._12_4_;
  auVar269 = vmaxps_avx(auVar262,auVar194);
  auVar263._0_4_ = fVar220 * auVar76._0_4_;
  auVar263._4_4_ = fVar236 * auVar76._4_4_;
  auVar263._8_4_ = fVar237 * auVar76._8_4_;
  auVar263._12_4_ = fVar238 * auVar76._12_4_;
  fVar124 = auVar153._0_4_;
  auVar115._0_4_ = fVar124 * auVar323._0_4_;
  fVar140 = auVar153._4_4_;
  auVar115._4_4_ = fVar140 * auVar323._4_4_;
  fVar141 = auVar153._8_4_;
  auVar115._8_4_ = fVar141 * auVar323._8_4_;
  fVar142 = auVar153._12_4_;
  auVar115._12_4_ = fVar142 * auVar323._12_4_;
  auVar277._0_4_ = fVar124 * auVar76._0_4_;
  auVar277._4_4_ = fVar140 * auVar76._4_4_;
  auVar277._8_4_ = fVar141 * auVar76._8_4_;
  auVar277._12_4_ = fVar142 * auVar76._12_4_;
  auVar134._0_4_ = auVar256._0_4_ + auVar269._0_4_;
  auVar134._4_4_ = auVar256._4_4_ + auVar269._4_4_;
  auVar134._8_4_ = auVar256._8_4_ + auVar269._8_4_;
  auVar134._12_4_ = auVar256._12_4_ + auVar269._12_4_;
  auVar195._8_8_ = 0x3f800000;
  auVar195._0_8_ = 0x3f800000;
  auVar256 = vsubps_avx(auVar195,auVar134);
  auVar269 = vsubps_avx(auVar195,auVar309);
  auVar310._0_4_ = fVar220 * auVar256._0_4_;
  auVar310._4_4_ = fVar236 * auVar256._4_4_;
  auVar310._8_4_ = fVar237 * auVar256._8_4_;
  auVar310._12_4_ = fVar238 * auVar256._12_4_;
  auVar292._0_4_ = fVar220 * auVar269._0_4_;
  auVar292._4_4_ = fVar236 * auVar269._4_4_;
  auVar292._8_4_ = fVar237 * auVar269._8_4_;
  auVar292._12_4_ = fVar238 * auVar269._12_4_;
  auVar135._0_4_ = fVar124 * auVar256._0_4_;
  auVar135._4_4_ = fVar140 * auVar256._4_4_;
  auVar135._8_4_ = fVar141 * auVar256._8_4_;
  auVar135._12_4_ = fVar142 * auVar256._12_4_;
  auVar196._0_4_ = fVar124 * auVar269._0_4_;
  auVar196._4_4_ = fVar140 * auVar269._4_4_;
  auVar196._8_4_ = fVar141 * auVar269._8_4_;
  auVar196._12_4_ = fVar142 * auVar269._12_4_;
  auVar256 = vminps_avx(auVar310,auVar292);
  auVar269 = vminps_avx(auVar135,auVar196);
  auVar256 = vminps_avx(auVar256,auVar269);
  auVar269 = vmaxps_avx(auVar292,auVar310);
  auVar298 = vmaxps_avx(auVar196,auVar135);
  auVar284 = vminps_avx(auVar320,auVar263);
  auVar323 = vminps_avx(auVar115,auVar277);
  auVar284 = vminps_avx(auVar284,auVar323);
  auVar256 = vhaddps_avx(auVar256,auVar284);
  auVar269 = vmaxps_avx(auVar298,auVar269);
  auVar298 = vmaxps_avx(auVar263,auVar320);
  auVar284 = vmaxps_avx(auVar277,auVar115);
  auVar298 = vmaxps_avx(auVar284,auVar298);
  auVar269 = vhaddps_avx(auVar269,auVar298);
  auVar256 = vshufps_avx(auVar256,auVar256,0xe8);
  auVar269 = vshufps_avx(auVar269,auVar269,0xe8);
  auVar278._0_4_ = auVar71._0_4_ + auVar256._0_4_;
  auVar278._4_4_ = auVar71._4_4_ + auVar256._4_4_;
  auVar278._8_4_ = auVar71._8_4_ + auVar256._8_4_;
  auVar278._12_4_ = auVar71._12_4_ + auVar256._12_4_;
  auVar264._0_4_ = auVar71._0_4_ + auVar269._0_4_;
  auVar264._4_4_ = auVar71._4_4_ + auVar269._4_4_;
  auVar264._8_4_ = auVar71._8_4_ + auVar269._8_4_;
  auVar264._12_4_ = auVar71._12_4_ + auVar269._12_4_;
  auVar256 = vmaxps_avx(auVar289,auVar278);
  auVar269 = vminps_avx(auVar264,auVar192);
  auVar256 = vcmpps_avx(auVar269,auVar256,1);
  auVar256 = vshufps_avx(auVar256,auVar256,0x50);
  if ((auVar256 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar256[0xf] < '\0')
  goto LAB_0123d2db;
  bVar59 = 0;
  if ((auVar234._0_4_ < auVar278._0_4_) && (bVar59 = 0, auVar264._0_4_ < auVar192._0_4_)) {
    auVar269 = vmovshdup_avx(auVar278);
    auVar256 = vcmpps_avx(auVar264,auVar192,1);
    bVar59 = auVar256[4] & auVar72._0_4_ < auVar269._0_4_;
  }
  p03.field_0.i[0] = auVar18._0_4_;
  p03.field_0.i[1] = auVar18._4_4_;
  p03.field_0.i[2] = auVar18._8_4_;
  p03.field_0.i[3] = auVar18._12_4_;
  if (((3 < (uint)uVar62 || fVar92 < 0.001) | bVar59) == 1) {
    lVar61 = 0xc9;
    do {
      lVar61 = lVar61 + -1;
      if (lVar61 == 0) goto LAB_0123d2db;
      fVar140 = auVar71._0_4_;
      fVar124 = 1.0 - fVar140;
      fVar92 = fVar124 * fVar124 * fVar124;
      fVar144 = fVar140 * 3.0 * fVar124 * fVar124;
      fVar124 = fVar124 * fVar140 * fVar140 * 3.0;
      auVar175._4_4_ = fVar92;
      auVar175._0_4_ = fVar92;
      auVar175._8_4_ = fVar92;
      auVar175._12_4_ = fVar92;
      auVar136._4_4_ = fVar144;
      auVar136._0_4_ = fVar144;
      auVar136._8_4_ = fVar144;
      auVar136._12_4_ = fVar144;
      auVar116._4_4_ = fVar124;
      auVar116._0_4_ = fVar124;
      auVar116._8_4_ = fVar124;
      auVar116._12_4_ = fVar124;
      fVar140 = fVar140 * fVar140 * fVar140;
      auVar197._0_4_ = p03.field_0.v[0] * fVar140;
      auVar197._4_4_ = p03.field_0.v[1] * fVar140;
      auVar197._8_4_ = p03.field_0.v[2] * fVar140;
      auVar197._12_4_ = p03.field_0.v[3] * fVar140;
      auVar16 = vfmadd231ps_fma(auVar197,auVar186,auVar116);
      auVar16 = vfmadd231ps_fma(auVar16,auVar22,auVar136);
      auVar16 = vfmadd231ps_fma(auVar16,auVar21,auVar175);
      auVar117._8_8_ = auVar16._0_8_;
      auVar117._0_8_ = auVar16._0_8_;
      auVar16 = vshufpd_avx(auVar16,auVar16,3);
      auVar256 = vshufps_avx(auVar71,auVar71,0x55);
      auVar16 = vsubps_avx(auVar16,auVar117);
      auVar256 = vfmadd213ps_fma(auVar16,auVar256,auVar117);
      fVar92 = auVar256._0_4_;
      auVar16 = vshufps_avx(auVar256,auVar256,0x55);
      auVar118._0_4_ = fVar145 * fVar92 + fVar143 * auVar16._0_4_;
      auVar118._4_4_ = auVar267._4_4_ * fVar92 + auVar268._4_4_ * auVar16._4_4_;
      auVar118._8_4_ = auVar267._8_4_ * fVar92 + auVar268._8_4_ * auVar16._8_4_;
      auVar118._12_4_ = auVar267._12_4_ * fVar92 + auVar268._12_4_ * auVar16._12_4_;
      auVar71 = vsubps_avx(auVar71,auVar118);
      auVar16 = vandps_avx(local_3d8,auVar256);
      auVar256 = vshufps_avx(auVar16,auVar16,0xf5);
      auVar16 = vmaxss_avx(auVar256,auVar16);
    } while (fVar94 <= auVar16._0_4_);
    local_1f8 = auVar71._0_4_;
    if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
      auVar16 = vmovshdup_avx(auVar71);
      fVar92 = auVar16._0_4_;
      if ((0.0 <= fVar92) && (fVar92 <= 1.0)) {
        auVar16 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar298 = vinsertps_avx(auVar16,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar16 = vdpps_avx(auVar298,local_3f8,0x7f);
        auVar256 = vdpps_avx(auVar298,local_408,0x7f);
        auVar267 = vdpps_avx(auVar298,auVar185,0x7f);
        auVar268 = vdpps_avx(auVar298,auVar23,0x7f);
        auVar269 = vdpps_avx(auVar298,auVar24,0x7f);
        auVar289 = vdpps_avx(auVar298,auVar164,0x7f);
        auVar192 = vdpps_avx(auVar298,auVar187,0x7f);
        auVar298 = vdpps_avx(auVar298,auVar69,0x7f);
        fVar144 = 1.0 - fVar92;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar269._0_4_)),ZEXT416((uint)fVar144),
                                  auVar16);
        auVar256 = vfmadd231ss_fma(ZEXT416((uint)(auVar289._0_4_ * fVar92)),ZEXT416((uint)fVar144),
                                   auVar256);
        auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar192._0_4_ * fVar92)),ZEXT416((uint)fVar144),
                                   auVar267);
        auVar268 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar298._0_4_)),ZEXT416((uint)fVar144),
                                   auVar268);
        fVar143 = 1.0 - local_1f8;
        fVar92 = fVar143 * local_1f8 * local_1f8 * 3.0;
        fVar140 = local_1f8 * local_1f8 * local_1f8;
        auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ * fVar140)),ZEXT416((uint)fVar92),
                                   auVar267);
        fVar144 = local_1f8 * 3.0 * fVar143 * fVar143;
        auVar256 = vfmadd231ss_fma(auVar267,ZEXT416((uint)fVar144),auVar256);
        fVar145 = fVar143 * fVar143 * fVar143;
        auVar16 = vfmadd231ss_fma(auVar256,ZEXT416((uint)fVar145),auVar16);
        fVar124 = auVar16._0_4_;
        if ((fVar68 <= fVar124) && (fVar141 = *(float *)(ray + k * 4 + 0x80), fVar124 <= fVar141)) {
          pGVar9 = (context->scene->geometries).items[uVar57].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar67 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar67 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1e8 = vshufps_avx(auVar71,auVar71,0x55);
            auVar250._8_4_ = 0x3f800000;
            auVar250._0_8_ = 0x3f8000003f800000;
            auVar250._12_4_ = 0x3f800000;
            auVar16 = vsubps_avx(auVar250,local_1e8);
            fVar142 = local_1e8._0_4_;
            auVar265._0_4_ = fVar142 * (float)local_438._0_4_;
            fVar220 = local_1e8._4_4_;
            auVar265._4_4_ = fVar220 * (float)local_438._4_4_;
            fVar236 = local_1e8._8_4_;
            auVar265._8_4_ = fVar236 * fStack_430;
            fVar237 = local_1e8._12_4_;
            auVar265._12_4_ = fVar237 * fStack_42c;
            local_4a8 = auVar162._0_4_;
            fStack_4a4 = auVar162._4_4_;
            fStack_4a0 = auVar162._8_4_;
            fStack_49c = auVar162._12_4_;
            auVar279._0_4_ = fVar142 * local_4a8;
            auVar279._4_4_ = fVar220 * fStack_4a4;
            auVar279._8_4_ = fVar236 * fStack_4a0;
            auVar279._12_4_ = fVar237 * fStack_49c;
            auVar287._0_4_ = fVar142 * (float)local_448._0_4_;
            auVar287._4_4_ = fVar220 * (float)local_448._4_4_;
            auVar287._8_4_ = fVar236 * fStack_440;
            auVar287._12_4_ = fVar237 * fStack_43c;
            local_4b8 = auVar163._0_4_;
            fStack_4b4 = auVar163._4_4_;
            fStack_4b0 = auVar163._8_4_;
            fStack_4ac = auVar163._12_4_;
            auVar293._0_4_ = fVar142 * local_4b8;
            auVar293._4_4_ = fVar220 * fStack_4b4;
            auVar293._8_4_ = fVar236 * fStack_4b0;
            auVar293._12_4_ = fVar237 * fStack_4ac;
            auVar256 = vfmadd231ps_fma(auVar265,auVar16,local_418);
            auVar267 = vfmadd231ps_fma(auVar279,auVar16,auVar146);
            auVar268 = vfmadd231ps_fma(auVar287,auVar16,local_428);
            auVar269 = vfmadd231ps_fma(auVar293,auVar16,auVar104);
            auVar16 = vsubps_avx(auVar267,auVar256);
            auVar256 = vsubps_avx(auVar268,auVar267);
            auVar267 = vsubps_avx(auVar269,auVar268);
            auVar288._0_4_ = auVar256._0_4_ * local_1f8;
            auVar288._4_4_ = auVar256._4_4_ * local_1f8;
            auVar288._8_4_ = auVar256._8_4_ * local_1f8;
            auVar288._12_4_ = auVar256._12_4_ * local_1f8;
            auVar216._4_4_ = fVar143;
            auVar216._0_4_ = fVar143;
            auVar216._8_4_ = fVar143;
            auVar216._12_4_ = fVar143;
            auVar16 = vfmadd231ps_fma(auVar288,auVar216,auVar16);
            auVar251._0_4_ = auVar267._0_4_ * local_1f8;
            auVar251._4_4_ = auVar267._4_4_ * local_1f8;
            auVar251._8_4_ = auVar267._8_4_ * local_1f8;
            auVar251._12_4_ = auVar267._12_4_ * local_1f8;
            auVar256 = vfmadd231ps_fma(auVar251,auVar216,auVar256);
            auVar252._0_4_ = auVar256._0_4_ * local_1f8;
            auVar252._4_4_ = auVar256._4_4_ * local_1f8;
            auVar252._8_4_ = auVar256._8_4_ * local_1f8;
            auVar252._12_4_ = auVar256._12_4_ * local_1f8;
            auVar256 = vfmadd231ps_fma(auVar252,auVar216,auVar16);
            local_368 = auVar96._0_4_;
            fStack_364 = auVar96._4_4_;
            fStack_360 = auVar96._8_4_;
            fStack_35c = auVar96._12_4_;
            auVar198._0_4_ = fVar140 * local_368;
            auVar198._4_4_ = fVar140 * fStack_364;
            auVar198._8_4_ = fVar140 * fStack_360;
            auVar198._12_4_ = fVar140 * fStack_35c;
            auVar137._4_4_ = fVar92;
            auVar137._0_4_ = fVar92;
            auVar137._8_4_ = fVar92;
            auVar137._12_4_ = fVar92;
            auVar16 = vfmadd132ps_fma(auVar137,auVar198,auVar125);
            auVar176._4_4_ = fVar144;
            auVar176._0_4_ = fVar144;
            auVar176._8_4_ = fVar144;
            auVar176._12_4_ = fVar144;
            auVar16 = vfmadd132ps_fma(auVar176,auVar16,auVar98);
            auVar138._0_4_ = auVar256._0_4_ * 3.0;
            auVar138._4_4_ = auVar256._4_4_ * 3.0;
            auVar138._8_4_ = auVar256._8_4_ * 3.0;
            auVar138._12_4_ = auVar256._12_4_ * 3.0;
            auVar158._4_4_ = fVar145;
            auVar158._0_4_ = fVar145;
            auVar158._8_4_ = fVar145;
            auVar158._12_4_ = fVar145;
            auVar256 = vfmadd132ps_fma(auVar158,auVar16,auVar97);
            auVar16 = vshufps_avx(auVar138,auVar138,0xc9);
            auVar177._0_4_ = auVar256._0_4_ * auVar16._0_4_;
            auVar177._4_4_ = auVar256._4_4_ * auVar16._4_4_;
            auVar177._8_4_ = auVar256._8_4_ * auVar16._8_4_;
            auVar177._12_4_ = auVar256._12_4_ * auVar16._12_4_;
            auVar16 = vshufps_avx(auVar256,auVar256,0xc9);
            auVar256 = vfmsub231ps_fma(auVar177,auVar138,auVar16);
            auVar16 = vshufps_avx(auVar256,auVar256,0x55);
            local_228[0] = (RTCHitN)auVar16[0];
            local_228[1] = (RTCHitN)auVar16[1];
            local_228[2] = (RTCHitN)auVar16[2];
            local_228[3] = (RTCHitN)auVar16[3];
            local_228[4] = (RTCHitN)auVar16[4];
            local_228[5] = (RTCHitN)auVar16[5];
            local_228[6] = (RTCHitN)auVar16[6];
            local_228[7] = (RTCHitN)auVar16[7];
            local_228[8] = (RTCHitN)auVar16[8];
            local_228[9] = (RTCHitN)auVar16[9];
            local_228[10] = (RTCHitN)auVar16[10];
            local_228[0xb] = (RTCHitN)auVar16[0xb];
            local_228[0xc] = (RTCHitN)auVar16[0xc];
            local_228[0xd] = (RTCHitN)auVar16[0xd];
            local_228[0xe] = (RTCHitN)auVar16[0xe];
            local_228[0xf] = (RTCHitN)auVar16[0xf];
            local_218 = vshufps_avx(auVar256,auVar256,0xaa);
            local_208 = auVar256._0_4_;
            uStack_204 = local_208;
            uStack_200 = local_208;
            uStack_1fc = local_208;
            fStack_1f4 = local_1f8;
            fStack_1f0 = local_1f8;
            fStack_1ec = local_1f8;
            local_1d8 = CONCAT44(uVar8,uVar8);
            uStack_1d0 = CONCAT44(uVar8,uVar8);
            local_1c8._4_4_ = uVar57;
            local_1c8._0_4_ = uVar57;
            local_1c8._8_4_ = uVar57;
            local_1c8._12_4_ = uVar57;
            vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
            uStack_1b4 = context->user->instID[0];
            local_1b8 = uStack_1b4;
            uStack_1b0 = uStack_1b4;
            uStack_1ac = uStack_1b4;
            uStack_1a8 = context->user->instPrimID[0];
            uStack_1a4 = uStack_1a8;
            uStack_1a0 = uStack_1a8;
            uStack_19c = uStack_1a8;
            *(float *)(ray + k * 4 + 0x80) = fVar124;
            local_468 = *local_458;
            args.valid = (int *)local_468;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_228;
            args.N = 4;
            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->occlusionFilterN)(&args);
            }
            if (local_468 == (undefined1  [16])0x0) {
              auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar16 = auVar16 ^ _DAT_01f46b70;
            }
            else {
              p_Var15 = context->args->filter;
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var15)(&args);
              }
              auVar256 = vpcmpeqd_avx(local_468,_DAT_01f45a50);
              auVar16 = auVar256 ^ _DAT_01f46b70;
              auVar139._8_4_ = 0xff800000;
              auVar139._0_8_ = 0xff800000ff800000;
              auVar139._12_4_ = 0xff800000;
              auVar256 = vblendvps_avx(auVar139,*(undefined1 (*) [16])(args.ray + 0x80),auVar256);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar256;
            }
            auVar119._8_8_ = 0x100000001;
            auVar119._0_8_ = 0x100000001;
            bVar67 = (auVar119 & auVar16) != (undefined1  [16])0x0;
            if (!bVar67) {
              *(float *)(ray + k * 4 + 0x80) = fVar141;
            }
          }
          bVar66 = (bool)(bVar66 | bVar67);
        }
      }
    }
    goto LAB_0123d2db;
  }
  auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar144),0x10);
  auVar76 = vinsertps_avx(auVar72,ZEXT416((uint)auVar73._0_4_),0x10);
  goto LAB_0123cd2a;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }